

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::LRN_x86_avx2::forward_inplace(LRN_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [24];
  undefined1 auVar58 [24];
  bool bVar59;
  float *pfVar60;
  undefined1 (*pauVar61) [32];
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  double dVar62;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar71 [32];
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_4;
  Mat m;
  float *ptr_2;
  int q_2;
  int j;
  int i_3;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  Option opt_b;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  __m256 _ssp_1;
  __m256 _p_1;
  __m256 _mb;
  __m256 _ads;
  __m256 _bias;
  int i_1;
  float *ssptr;
  float *ptr_1;
  __m256 _ssp;
  __m256 _sp;
  int i_2;
  float *ssptr_1;
  float *sptr;
  int p;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  __m256 _outp;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  __m256 pow2n;
  __m256 y_1;
  __m256 z_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  undefined4 in_stack_ffffffffffffde60;
  undefined4 in_stack_ffffffffffffde64;
  Mat *in_stack_ffffffffffffde68;
  Mat *this_00;
  undefined4 in_stack_ffffffffffffde70;
  float in_stack_ffffffffffffde74;
  undefined4 in_stack_ffffffffffffde78;
  int in_stack_ffffffffffffde7c;
  int in_stack_ffffffffffffde80;
  int in_stack_ffffffffffffde84;
  undefined4 in_stack_ffffffffffffde88;
  float in_stack_ffffffffffffde8c;
  Mat *in_stack_ffffffffffffde90;
  undefined8 in_stack_ffffffffffffde98;
  undefined8 in_stack_ffffffffffffdea0;
  undefined8 in_stack_ffffffffffffdea8;
  undefined7 in_stack_ffffffffffffdeb0;
  undefined1 in_stack_ffffffffffffdeb7;
  undefined4 in_stack_ffffffffffffdeb8;
  undefined4 in_stack_ffffffffffffdebc;
  int in_stack_ffffffffffffdec8;
  undefined4 in_stack_ffffffffffffded0;
  undefined4 in_stack_ffffffffffffded4;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  int local_1dd8;
  float local_1dd4;
  int local_1dc8;
  int local_1dc4;
  Mat local_1dc0;
  Mat local_1d78;
  float *local_1d30;
  int local_1d28;
  int local_1d24;
  int local_1d20;
  int local_1d1c;
  int local_1d18;
  int local_1d14;
  reference local_1d10;
  vector<int,_std::allocator<int>_> local_1d00;
  float local_1ce8;
  int local_1ce4;
  Mat local_1ce0;
  int local_1c94;
  int local_1c64;
  int local_1c60;
  int local_1c48;
  int local_1c44;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined1 local_1c00 [32];
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  int local_1b84;
  Mat local_1b80;
  float *local_1b38;
  Mat local_1b30;
  undefined1 (*local_1ae8) [32];
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  int local_1a9c;
  Mat local_1a98;
  undefined1 (*local_1a50) [32];
  Mat local_1a48;
  float *local_1a00;
  int local_19f4;
  int local_19f0;
  float local_19ec;
  Mat local_19e8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  int local_194c;
  Mat local_1948;
  undefined1 (*local_1900) [32];
  Mat local_18f8;
  float *local_18b0;
  int local_18a4;
  int local_18a0;
  Mat local_1890;
  int local_1844;
  undefined8 local_1840;
  int local_1834;
  int local_1830;
  int local_182c;
  undefined8 *local_1828;
  int local_180c;
  float *local_1808;
  undefined1 (*local_1800) [32];
  undefined1 (*local_17f8) [32];
  float *local_17f0;
  float *local_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined1 (*local_16e8) [32];
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined1 (*local_16a8) [32];
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined1 (*local_1668) [32];
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  uint local_15cc;
  float local_15c8;
  uint local_15c4;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined1 local_1540 [32];
  uint local_1520;
  uint local_151c;
  uint local_1518;
  uint local_1514;
  uint local_1510;
  uint local_150c;
  uint local_1508;
  uint local_1504;
  undefined1 local_1500 [32];
  float local_14e0;
  float local_14dc;
  float local_14d8;
  float local_14d4;
  float local_14d0;
  float local_14cc;
  float local_14c8;
  float local_14c4;
  undefined1 local_14c0 [32];
  uint local_14a0;
  uint local_149c;
  uint local_1498;
  uint local_1494;
  uint local_1490;
  uint local_148c;
  uint local_1488;
  uint local_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  undefined1 local_1420 [32];
  undefined4 local_1400;
  undefined4 uStack_13fc;
  undefined4 uStack_13f8;
  undefined4 uStack_13f4;
  undefined4 uStack_13f0;
  undefined4 uStack_13ec;
  undefined4 uStack_13e8;
  undefined4 uStack_13e4;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [8];
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [8];
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [8];
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined4 local_1160;
  undefined4 uStack_115c;
  undefined4 uStack_1158;
  undefined4 uStack_1154;
  undefined4 uStack_1150;
  undefined4 uStack_114c;
  undefined4 uStack_1148;
  undefined4 uStack_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined4 local_1120;
  undefined4 uStack_111c;
  undefined4 uStack_1118;
  undefined4 uStack_1114;
  undefined4 uStack_1110;
  undefined4 uStack_110c;
  undefined4 uStack_1108;
  undefined4 uStack_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined4 local_10e0;
  undefined4 uStack_10dc;
  undefined4 uStack_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c8;
  undefined4 uStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined4 local_fe0;
  undefined4 uStack_fdc;
  undefined4 uStack_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  undefined4 uStack_fc8;
  undefined4 uStack_fc4;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined4 local_fa0;
  undefined4 uStack_f9c;
  undefined4 uStack_f98;
  undefined4 uStack_f94;
  undefined4 uStack_f90;
  undefined4 uStack_f8c;
  undefined4 uStack_f88;
  undefined4 uStack_f84;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined4 local_f60;
  undefined4 uStack_f5c;
  undefined4 uStack_f58;
  undefined4 uStack_f54;
  undefined4 uStack_f50;
  undefined4 uStack_f4c;
  undefined4 uStack_f48;
  undefined4 uStack_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined4 local_f20;
  undefined4 uStack_f1c;
  undefined4 uStack_f18;
  undefined4 uStack_f14;
  undefined4 uStack_f10;
  undefined4 uStack_f0c;
  undefined4 uStack_f08;
  undefined4 uStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined4 local_ee0;
  undefined4 uStack_edc;
  undefined4 uStack_ed8;
  undefined4 uStack_ed4;
  undefined4 uStack_ed0;
  undefined4 uStack_ecc;
  undefined4 uStack_ec8;
  undefined4 uStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 local_ea0 [8];
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined1 local_e60 [8];
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined1 local_e40 [32];
  undefined1 local_e20 [8];
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined1 local_e00 [32];
  undefined4 local_de0;
  undefined4 uStack_ddc;
  undefined4 uStack_dd8;
  undefined4 uStack_dd4;
  undefined4 uStack_dd0;
  undefined4 uStack_dcc;
  undefined4 uStack_dc8;
  undefined4 uStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined1 local_da0 [8];
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined4 local_d80;
  undefined4 uStack_d7c;
  undefined4 uStack_d78;
  undefined4 uStack_d74;
  undefined4 uStack_d70;
  undefined4 uStack_d6c;
  undefined4 uStack_d68;
  undefined4 uStack_d64;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined4 local_d40;
  undefined4 uStack_d3c;
  undefined4 uStack_d38;
  undefined4 uStack_d34;
  undefined4 uStack_d30;
  undefined4 uStack_d2c;
  undefined4 uStack_d28;
  undefined4 uStack_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined4 local_d00;
  undefined4 uStack_cfc;
  undefined4 uStack_cf8;
  undefined4 uStack_cf4;
  undefined4 uStack_cf0;
  undefined4 uStack_cec;
  undefined4 uStack_ce8;
  undefined4 uStack_ce4;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined4 local_940;
  undefined4 uStack_93c;
  undefined4 uStack_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 uStack_928;
  undefined4 uStack_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined4 local_840;
  undefined4 uStack_83c;
  undefined4 uStack_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined4 uStack_7f0;
  undefined4 uStack_7ec;
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 uStack_7a8;
  undefined4 uStack_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 uStack_768;
  undefined4 uStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  undefined4 uStack_668;
  undefined4 uStack_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined4 local_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined4 local_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_182c = *(int *)(in_RSI + 0x2c);
  local_1830 = *(int *)(in_RSI + 0x30);
  local_1834 = *(int *)(in_RSI + 0x38);
  local_1840 = *(undefined8 *)(in_RSI + 0x10);
  local_1844 = local_182c * local_1830;
  local_1828 = in_RDX;
  ncnn::Mat::Mat(&local_1890);
  ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffde8c,in_stack_ffffffffffffde88),
                    in_stack_ffffffffffffde84,in_stack_ffffffffffffde80,in_stack_ffffffffffffde7c,
                    CONCAT44(in_stack_ffffffffffffde74,in_stack_ffffffffffffde70),
                    (Allocator *)in_stack_ffffffffffffde68);
  bVar59 = ncnn::Mat::empty(in_stack_ffffffffffffde68);
  if (bVar59) {
    local_180c = -100;
    local_18a0 = 1;
    goto LAB_004b6b65;
  }
  for (local_18a4 = 0; fVar66 = (float)((ulong)in_stack_ffffffffffffde98 >> 0x20),
      local_18a4 < local_1834; local_18a4 = local_18a4 + 1) {
    ncnn::Mat::channel(in_stack_ffffffffffffde90,(int)in_stack_ffffffffffffde8c);
    pfVar60 = ncnn::Mat::operator_cast_to_float_(&local_18f8);
    ncnn::Mat::~Mat((Mat *)0x4b42a1);
    local_18b0 = pfVar60;
    ncnn::Mat::channel(in_stack_ffffffffffffde90,(int)in_stack_ffffffffffffde8c);
    pauVar61 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1948);
    ncnn::Mat::~Mat((Mat *)0x4b42f3);
    local_1900 = pauVar61;
    for (local_194c = 0; local_194c + 7 < local_1844; local_194c = local_194c + 8) {
      local_17e8 = local_18b0;
      local_1980 = *(undefined8 *)local_18b0;
      uStack_1978 = *(undefined8 *)(local_18b0 + 2);
      uStack_1970 = *(undefined8 *)(local_18b0 + 4);
      uStack_1968 = *(undefined8 *)(local_18b0 + 6);
      local_1740._0_4_ = (float)local_1980;
      local_1740._4_4_ = (float)((ulong)local_1980 >> 0x20);
      uStack_1738._0_4_ = (float)uStack_1978;
      uStack_1738._4_4_ = (float)((ulong)uStack_1978 >> 0x20);
      uStack_1730._0_4_ = (float)uStack_1970;
      uStack_1730._4_4_ = (float)((ulong)uStack_1970 >> 0x20);
      uStack_1728._0_4_ = (float)uStack_1968;
      uStack_1728._4_4_ = (undefined4)((ulong)uStack_1968 >> 0x20);
      local_19a0 = CONCAT44(local_1740._4_4_ * local_1740._4_4_,
                            (float)local_1740 * (float)local_1740);
      uStack_1998 = CONCAT44(uStack_1738._4_4_ * uStack_1738._4_4_,
                             (float)uStack_1738 * (float)uStack_1738);
      uStack_1990 = CONCAT44(uStack_1730._4_4_ * uStack_1730._4_4_,
                             (float)uStack_1730 * (float)uStack_1730);
      uStack_1988 = CONCAT44(uStack_1728._4_4_,(float)uStack_1728 * (float)uStack_1728);
      local_1668 = local_1900;
      auVar7._8_8_ = uStack_1998;
      auVar7._0_8_ = local_19a0;
      auVar7._16_8_ = uStack_1990;
      auVar7._24_8_ = uStack_1988;
      *local_1900 = auVar7;
      local_18b0 = local_18b0 + 8;
      local_1900 = local_1900 + 1;
      local_1760 = local_1980;
      uStack_1758 = uStack_1978;
      uStack_1750 = uStack_1970;
      uStack_1748 = uStack_1968;
      local_1740 = local_1980;
      uStack_1738 = uStack_1978;
      uStack_1730 = uStack_1970;
      uStack_1728 = uStack_1968;
      local_16a0 = local_19a0;
      uStack_1698 = uStack_1998;
      uStack_1690 = uStack_1990;
      uStack_1688 = uStack_1988;
    }
    for (; local_194c < local_1844; local_194c = local_194c + 1) {
      *(float *)*local_1900 = *local_18b0 * *local_18b0;
      local_18b0 = local_18b0 + 1;
      local_1900 = (undefined1 (*) [32])(*local_1900 + 4);
    }
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
    ncnn::Mat::Mat(&local_19e8);
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffde8c,in_stack_ffffffffffffde88),
                      in_stack_ffffffffffffde84,in_stack_ffffffffffffde80,in_stack_ffffffffffffde7c,
                      CONCAT44(in_stack_ffffffffffffde74,in_stack_ffffffffffffde70),
                      (Allocator *)in_stack_ffffffffffffde68);
    bVar59 = ncnn::Mat::empty(in_stack_ffffffffffffde68);
    if (bVar59) {
      local_180c = -100;
      local_18a0 = 1;
    }
    else {
      ncnn::Mat::fill((Mat *)CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),
                      in_stack_ffffffffffffde74);
      local_19ec = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
                   (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      for (local_19f0 = 0; local_19f0 < local_1834; local_19f0 = local_19f0 + 1) {
        for (local_19f4 = local_19f0 -
                          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            local_19f4 <=
            local_19f0 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            local_19f4 = local_19f4 + 1) {
          if ((-1 < local_19f4) && (local_19f4 < local_1834)) {
            ncnn::Mat::channel(in_stack_ffffffffffffde90,(int)in_stack_ffffffffffffde8c);
            pfVar60 = ncnn::Mat::operator_cast_to_float_(&local_1a48);
            ncnn::Mat::~Mat((Mat *)0x4b4704);
            local_1a00 = pfVar60;
            ncnn::Mat::channel(in_stack_ffffffffffffde90,(int)in_stack_ffffffffffffde8c);
            pauVar61 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1a98);
            ncnn::Mat::~Mat((Mat *)0x4b4756);
            local_1a50 = pauVar61;
            for (local_1a9c = 0; local_1a9c + 7 < local_1844; local_1a9c = local_1a9c + 8) {
              local_17f0 = local_1a00;
              local_1ac0 = *(undefined8 *)local_1a00;
              uStack_1ab8 = *(undefined8 *)(local_1a00 + 2);
              uStack_1ab0 = *(undefined8 *)(local_1a00 + 4);
              uStack_1aa8 = *(undefined8 *)(local_1a00 + 6);
              local_17f8 = local_1a50;
              uVar10 = *(undefined8 *)*local_1a50;
              uVar11 = *(undefined8 *)(*local_1a50 + 8);
              uVar12 = *(undefined8 *)(*local_1a50 + 0x10);
              uVar13 = *(undefined8 *)(*local_1a50 + 0x18);
              local_1600._0_4_ = (float)uVar10;
              local_1600._4_4_ = (float)((ulong)uVar10 >> 0x20);
              uStack_15f8._0_4_ = (float)uVar11;
              uStack_15f8._4_4_ = (float)((ulong)uVar11 >> 0x20);
              uStack_15f0._0_4_ = (float)uVar12;
              uStack_15f0._4_4_ = (float)((ulong)uVar12 >> 0x20);
              uStack_15e8._0_4_ = (float)uVar13;
              uStack_15e8._4_4_ = (float)((ulong)uVar13 >> 0x20);
              local_1620._0_4_ = (float)local_1ac0;
              local_1620._4_4_ = (float)((ulong)local_1ac0 >> 0x20);
              uStack_1618._0_4_ = (float)uStack_1ab8;
              uStack_1618._4_4_ = (float)((ulong)uStack_1ab8 >> 0x20);
              uStack_1610._0_4_ = (float)uStack_1ab0;
              uStack_1610._4_4_ = (float)((ulong)uStack_1ab0 >> 0x20);
              uStack_1608._0_4_ = (float)uStack_1aa8;
              uStack_1608._4_4_ = (float)((ulong)uStack_1aa8 >> 0x20);
              local_1ae0 = CONCAT44(local_1600._4_4_ + local_1620._4_4_,
                                    (float)local_1600 + (float)local_1620);
              uStack_1ad8 = CONCAT44(uStack_15f8._4_4_ + uStack_1618._4_4_,
                                     (float)uStack_15f8 + (float)uStack_1618);
              uStack_1ad0 = CONCAT44(uStack_15f0._4_4_ + uStack_1610._4_4_,
                                     (float)uStack_15f0 + (float)uStack_1610);
              uStack_1ac8 = CONCAT44(uStack_15e8._4_4_ + uStack_1608._4_4_,
                                     (float)uStack_15e8 + (float)uStack_1608);
              local_16a8 = local_1a50;
              auVar9._8_8_ = uStack_1ad8;
              auVar9._0_8_ = local_1ae0;
              auVar9._16_8_ = uStack_1ad0;
              auVar9._24_8_ = uStack_1ac8;
              *local_1a50 = auVar9;
              local_1a00 = local_1a00 + 8;
              local_1a50 = local_1a50 + 1;
              local_16e0 = local_1ae0;
              uStack_16d8 = uStack_1ad8;
              uStack_16d0 = uStack_1ad0;
              uStack_16c8 = uStack_1ac8;
              local_1620 = local_1ac0;
              uStack_1618 = uStack_1ab8;
              uStack_1610 = uStack_1ab0;
              uStack_1608 = uStack_1aa8;
              local_1600 = uVar10;
              uStack_15f8 = uVar11;
              uStack_15f0 = uVar12;
              uStack_15e8 = uVar13;
            }
            for (; local_1a9c < local_1844; local_1a9c = local_1a9c + 1) {
              *(float *)*local_1a50 = *local_1a00 + *(float *)*local_1a50;
              local_1a00 = local_1a00 + 1;
              local_1a50 = (undefined1 (*) [32])(*local_1a50 + 4);
            }
          }
        }
        ncnn::Mat::channel(in_stack_ffffffffffffde90,(int)in_stack_ffffffffffffde8c);
        pauVar61 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1b30);
        ncnn::Mat::~Mat((Mat *)0x4b49ce);
        local_1ae8 = pauVar61;
        ncnn::Mat::channel(in_stack_ffffffffffffde90,(int)in_stack_ffffffffffffde8c);
        pfVar60 = ncnn::Mat::operator_cast_to_float_(&local_1b80);
        ncnn::Mat::~Mat((Mat *)0x4b4a20);
        local_1b84 = 0;
        local_15c4 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
        auVar1 = vinsertps_avx(ZEXT416(local_15c4),ZEXT416(local_15c4),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_15c4),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_15c4),0x30);
        auVar2 = vinsertps_avx(ZEXT416(local_15c4),ZEXT416(local_15c4),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(local_15c4),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(local_15c4),0x30);
        auVar63._16_16_ = auVar1;
        auVar63._0_16_ = auVar2;
        local_1540._0_8_ = auVar2._0_8_;
        local_1540._8_8_ = auVar2._8_8_;
        local_1540._16_8_ = auVar1._0_8_;
        local_1540._24_8_ = auVar1._8_8_;
        local_1bc0 = local_1540._0_8_;
        uStack_1bb8 = local_1540._8_8_;
        uStack_1bb0 = local_1540._16_8_;
        uStack_1ba8 = local_1540._24_8_;
        local_15c8 = local_19ec;
        local_14c4 = local_19ec;
        local_14c8 = local_19ec;
        local_14cc = local_19ec;
        local_14d0 = local_19ec;
        local_14d4 = local_19ec;
        local_14d8 = local_19ec;
        local_14dc = local_19ec;
        local_14e0 = local_19ec;
        auVar3 = vinsertps_avx(ZEXT416((uint)local_19ec),ZEXT416((uint)local_19ec),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_19ec),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_19ec),0x30);
        auVar4 = vinsertps_avx(ZEXT416((uint)local_19ec),ZEXT416((uint)local_19ec),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_19ec),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_19ec),0x30);
        auVar64._16_16_ = auVar3;
        auVar64._0_16_ = auVar4;
        local_1500._0_8_ = auVar4._0_8_;
        local_1500._8_8_ = auVar4._8_8_;
        local_1500._16_8_ = auVar3._0_8_;
        local_1500._24_8_ = auVar3._8_8_;
        local_1be0 = local_1500._0_8_;
        uStack_1bd8 = local_1500._8_8_;
        uStack_1bd0 = local_1500._16_8_;
        uStack_1bc8 = local_1500._24_8_;
        local_15cc = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) ^ 0x80000000;
        auVar5 = vinsertps_avx(ZEXT416(local_15cc),ZEXT416(local_15cc),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(local_15cc),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(local_15cc),0x30);
        auVar6 = vinsertps_avx(ZEXT416(local_15cc),ZEXT416(local_15cc),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(local_15cc),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(local_15cc),0x30);
        auVar65._16_16_ = auVar5;
        auVar65._0_16_ = auVar6;
        local_14c0._0_8_ = auVar6._0_8_;
        local_14c0._8_8_ = auVar6._8_8_;
        local_14c0._16_8_ = auVar5._0_8_;
        local_14c0._24_8_ = auVar5._8_8_;
        local_1c00._16_8_ = local_14c0._16_8_;
        local_1c00._0_16_ = auVar6;
        local_1c00._24_8_ = local_14c0._24_8_;
        local_1b38 = pfVar60;
        for (; local_1520 = local_15c4, local_151c = local_15c4, local_1518 = local_15c4,
            local_1514 = local_15c4, local_1510 = local_15c4, local_150c = local_15c4,
            local_1508 = local_15c4, local_1504 = local_15c4, local_14a0 = local_15cc,
            local_149c = local_15cc, local_1498 = local_15cc, local_1494 = local_15cc,
            local_1490 = local_15cc, local_148c = local_15cc, local_1488 = local_15cc,
            local_1484 = local_15cc, local_1b84 + 7 < local_1844; local_1b84 = local_1b84 + 8) {
          local_1800 = local_1ae8;
          uVar10 = *(undefined8 *)*local_1ae8;
          uVar11 = *(undefined8 *)(*local_1ae8 + 8);
          uVar12 = *(undefined8 *)(*local_1ae8 + 0x10);
          uVar13 = *(undefined8 *)(*local_1ae8 + 0x18);
          local_1808 = local_1b38;
          uVar14 = *(undefined8 *)local_1b38;
          uVar15 = *(undefined8 *)(local_1b38 + 2);
          uVar16 = *(undefined8 *)(local_1b38 + 4);
          uVar17 = *(undefined8 *)(local_1b38 + 6);
          local_1780._0_4_ = (float)uVar14;
          local_1780._4_4_ = (float)((ulong)uVar14 >> 0x20);
          uStack_1778._0_4_ = (float)uVar15;
          uStack_1778._4_4_ = (float)((ulong)uVar15 >> 0x20);
          uStack_1770._0_4_ = (float)uVar16;
          uStack_1770._4_4_ = (float)((ulong)uVar16 >> 0x20);
          uStack_1768._0_4_ = (float)uVar17;
          uStack_1768._4_4_ = (float)((ulong)uVar17 >> 0x20);
          local_17a0._0_4_ = auVar4._0_4_;
          local_17a0._4_4_ = auVar4._4_4_;
          uStack_1798._0_4_ = auVar4._8_4_;
          uStack_1798._4_4_ = auVar4._12_4_;
          uStack_1790._0_4_ = auVar3._0_4_;
          uStack_1790._4_4_ = auVar3._4_4_;
          uStack_1788._0_4_ = auVar3._8_4_;
          local_1640 = CONCAT44(local_1780._4_4_ * local_17a0._4_4_,
                                (float)local_1780 * (float)local_17a0);
          uStack_1638 = CONCAT44(uStack_1778._4_4_ * uStack_1798._4_4_,
                                 (float)uStack_1778 * (float)uStack_1798);
          uStack_1630 = CONCAT44(uStack_1770._4_4_ * uStack_1790._4_4_,
                                 (float)uStack_1770 * (float)uStack_1790);
          uStack_1628 = CONCAT44(uStack_1768._4_4_,(float)uStack_1768 * (float)uStack_1788);
          local_1660._0_4_ = auVar2._0_4_;
          local_1660._4_4_ = auVar2._4_4_;
          uStack_1658._0_4_ = auVar2._8_4_;
          uStack_1658._4_4_ = auVar2._12_4_;
          uStack_1650._0_4_ = auVar1._0_4_;
          uStack_1650._4_4_ = auVar1._4_4_;
          uStack_1648._0_4_ = auVar1._8_4_;
          uStack_1648._4_4_ = auVar1._12_4_;
          local_15a0 = CONCAT44(local_1780._4_4_ * local_17a0._4_4_ + local_1660._4_4_,
                                (float)local_1780 * (float)local_17a0 + (float)local_1660);
          uStack_1598 = CONCAT44(uStack_1778._4_4_ * uStack_1798._4_4_ + uStack_1658._4_4_,
                                 (float)uStack_1778 * (float)uStack_1798 + (float)uStack_1658);
          uStack_1590 = CONCAT44(uStack_1770._4_4_ * uStack_1790._4_4_ + uStack_1650._4_4_,
                                 (float)uStack_1770 * (float)uStack_1790 + (float)uStack_1650);
          uStack_1588 = CONCAT44(uStack_1768._4_4_ + uStack_1648._4_4_,
                                 (float)uStack_1768 * (float)uStack_1788 + (float)uStack_1648);
          local_15c0 = local_14c0._0_8_;
          uStack_15b8 = local_14c0._8_8_;
          uStack_15b0 = local_14c0._16_8_;
          uStack_15a8 = local_14c0._24_8_;
          uStack_d98 = uStack_1598;
          local_da0 = (undefined1  [8])local_15a0;
          uStack_d90 = uStack_1590;
          uStack_d88 = uStack_1588;
          local_de0 = 0x3f800000;
          uStack_ddc = 0x3f800000;
          uStack_dd8 = 0x3f800000;
          uStack_dd4 = 0x3f800000;
          uStack_dd0 = 0x3f800000;
          uStack_dcc = 0x3f800000;
          uStack_dc8 = 0x3f800000;
          uStack_dc4 = 0x3f800000;
          local_6c0 = ZEXT832(0) << 0x20;
          local_e00 = vcmpps_avx(_local_da0,local_6c0,2);
          local_640 = 0x800000;
          uStack_63c = 0x800000;
          uStack_638 = 0x800000;
          uStack_634 = 0x800000;
          uStack_630 = 0x800000;
          uStack_62c = 0x800000;
          uStack_628 = 0x800000;
          uStack_624 = 0x800000;
          auVar41._16_8_ = uStack_1590;
          auVar41._0_16_ = _local_da0;
          auVar41._24_8_ = uStack_1588;
          auVar40._8_4_ = 0x800000;
          auVar40._0_8_ = 0x80000000800000;
          auVar40._12_4_ = 0x800000;
          auVar40._16_4_ = 0x800000;
          auVar40._20_4_ = 0x800000;
          auVar40._24_4_ = 0x800000;
          auVar40._28_4_ = 0x800000;
          auVar7 = vmaxps_avx(auVar41,auVar40);
          local_da0 = auVar7._0_8_;
          local_1c0 = local_da0;
          uStack_d98 = auVar7._8_8_;
          uStack_1b8 = uStack_d98;
          uStack_d90 = auVar7._16_8_;
          uStack_1b0 = uStack_d90;
          uStack_d88 = auVar7._24_8_;
          uStack_1a8 = uStack_d88;
          local_1e0 = local_da0;
          uStack_1d8 = uStack_d98;
          uStack_1d0 = uStack_d90;
          uStack_1c8 = uStack_d88;
          local_1e4 = 0x17;
          local_a0 = local_da0;
          uStack_98 = uStack_d98;
          uStack_90 = uStack_d90;
          uStack_88 = uStack_d88;
          local_a4 = 0x17;
          auVar9 = vpsrld_avx2(auVar7,ZEXT416(0x17));
          local_2060 = auVar9._0_8_;
          uStack_2058 = auVar9._8_8_;
          uStack_2050 = auVar9._16_8_;
          uStack_2048 = auVar9._24_8_;
          local_520 = local_da0;
          uStack_518 = uStack_d98;
          uStack_510 = uStack_d90;
          uStack_508 = uStack_d88;
          local_540 = 0x807fffff;
          uStack_53c = 0x807fffff;
          uStack_538 = 0x807fffff;
          uStack_534 = 0x807fffff;
          uStack_530 = 0x807fffff;
          uStack_52c = 0x807fffff;
          uStack_528 = 0x807fffff;
          uStack_524 = 0x807fffff;
          auVar44._8_4_ = 0x807fffff;
          auVar44._0_8_ = 0x807fffff807fffff;
          auVar44._12_4_ = 0x807fffff;
          auVar44._16_4_ = 0x807fffff;
          auVar44._20_4_ = 0x807fffff;
          auVar44._24_4_ = 0x807fffff;
          auVar44._28_4_ = 0x807fffff;
          auVar7 = vpand_avx2(auVar7,auVar44);
          local_da0 = auVar7._0_8_;
          local_140 = local_da0;
          uStack_d98 = auVar7._8_8_;
          uStack_138 = uStack_d98;
          uStack_d90 = auVar7._16_8_;
          uStack_130 = uStack_d90;
          uStack_d88 = auVar7._24_8_;
          uStack_128 = uStack_d88;
          local_160 = 0x3f000000;
          uStack_15c = 0x3f000000;
          uStack_158 = 0x3f000000;
          uStack_154 = 0x3f000000;
          uStack_150 = 0x3f000000;
          uStack_14c = 0x3f000000;
          uStack_148 = 0x3f000000;
          uStack_144 = 0x3f000000;
          auVar55._8_4_ = 0x3f000000;
          auVar55._0_8_ = 0x3f0000003f000000;
          auVar55._12_4_ = 0x3f000000;
          auVar55._16_4_ = 0x3f000000;
          auVar55._20_4_ = 0x3f000000;
          auVar55._24_4_ = 0x3f000000;
          auVar55._28_4_ = 0x3f000000;
          auVar8 = vpor_avx2(auVar7,auVar55);
          local_100 = local_2060;
          uStack_f8 = uStack_2058;
          uStack_f0 = uStack_2050;
          uStack_e8 = uStack_2048;
          local_120 = 0x7f0000007f;
          uStack_118 = 0x7f0000007f;
          uStack_110 = 0x7f0000007f;
          uStack_108 = 0x7f0000007f;
          local_60 = local_2060;
          uStack_58 = uStack_2058;
          uStack_50 = uStack_2050;
          uStack_48 = uStack_2048;
          local_80 = 0x7f0000007f;
          uStack_78 = 0x7f0000007f;
          uStack_70 = 0x7f0000007f;
          uStack_68 = 0x7f0000007f;
          auVar56._8_8_ = 0x7f0000007f;
          auVar56._0_8_ = 0x7f0000007f;
          auVar56._16_8_ = 0x7f0000007f;
          auVar56._24_8_ = 0x7f0000007f;
          auVar7 = vpsubd_avx2(auVar9,auVar56);
          local_20a0 = auVar7._0_8_;
          local_dc0 = local_20a0;
          uStack_2098 = auVar7._8_8_;
          uStack_db8 = uStack_2098;
          uStack_2090 = auVar7._16_8_;
          uStack_db0 = uStack_2090;
          uStack_2088 = auVar7._24_8_;
          uStack_da8 = uStack_2088;
          local_e0 = local_20a0;
          uStack_d8 = uStack_2098;
          uStack_d0 = uStack_2090;
          uStack_c8 = uStack_2088;
          auVar7 = vcvtdq2ps_avx(auVar7);
          local_e20 = auVar7._0_8_;
          uVar18 = local_e20;
          uStack_e18 = auVar7._8_8_;
          uVar19 = uStack_e18;
          uStack_e10 = auVar7._16_8_;
          uVar20 = uStack_e10;
          uStack_e08 = auVar7._24_8_;
          uVar21 = uStack_e08;
          local_700 = 0x3f8000003f800000;
          uStack_6f8 = 0x3f8000003f800000;
          uStack_6f0 = 0x3f8000003f800000;
          uStack_6e8 = 0x3f8000003f800000;
          local_6e0._0_4_ = auVar7._0_4_;
          local_6e0._4_4_ = auVar7._4_4_;
          uStack_6d8._0_4_ = auVar7._8_4_;
          uStack_6d8._4_4_ = auVar7._12_4_;
          uStack_6d0._0_4_ = auVar7._16_4_;
          uStack_6d0._4_4_ = auVar7._20_4_;
          uStack_6c8._0_4_ = auVar7._24_4_;
          uStack_6c8._4_4_ = auVar7._28_4_;
          local_e20._4_4_ = local_6e0._4_4_ + 1.0;
          local_e20._0_4_ = (float)local_6e0 + 1.0;
          uStack_e18._0_4_ = (float)uStack_6d8 + 1.0;
          uStack_e18._4_4_ = uStack_6d8._4_4_ + 1.0;
          uStack_e10._0_4_ = (float)uStack_6d0 + 1.0;
          uStack_e10._4_4_ = uStack_6d0._4_4_ + 1.0;
          auVar57 = _local_e20;
          uStack_e08._0_4_ = (float)uStack_6c8 + 1.0;
          uStack_e08._4_4_ = uStack_6c8._4_4_ + 1.0;
          auVar38 = _local_e20;
          auVar71._8_4_ = 0x3f3504f3;
          auVar71._0_8_ = 0x3f3504f33f3504f3;
          auVar71._12_4_ = 0x3f3504f3;
          auVar71._16_4_ = 0x3f3504f3;
          auVar71._20_4_ = 0x3f3504f3;
          auVar71._24_4_ = 0x3f3504f3;
          auVar71._28_4_ = 0x3f3504f3;
          local_e40 = vcmpps_avx(auVar8,auVar71,1);
          local_da0 = auVar8._0_8_;
          local_560 = local_da0;
          uStack_d98 = auVar8._8_8_;
          uStack_558 = uStack_d98;
          uStack_d90 = auVar8._16_8_;
          uStack_550 = uStack_d90;
          uStack_d88 = auVar8._24_8_;
          uStack_548 = uStack_d88;
          local_580 = local_e40._0_8_;
          uStack_578 = local_e40._8_8_;
          uStack_570 = local_e40._16_8_;
          uStack_568 = local_e40._24_8_;
          auVar9 = vpand_avx2(auVar8,local_e40);
          local_420 = local_da0;
          uStack_418 = uStack_d98;
          uStack_410 = uStack_d90;
          uStack_408 = uStack_d88;
          local_440 = 0x3f8000003f800000;
          uStack_438 = 0x3f8000003f800000;
          uStack_430 = 0x3f8000003f800000;
          uStack_428 = 0x3f8000003f800000;
          auVar49._8_8_ = 0x3f8000003f800000;
          auVar49._0_8_ = 0x3f8000003f800000;
          auVar49._16_8_ = 0x3f8000003f800000;
          auVar49._24_8_ = 0x3f8000003f800000;
          auVar7 = vsubps_avx(auVar8,auVar49);
          local_460 = local_e20;
          uStack_458 = uStack_e18;
          uStack_e10 = auVar57._16_8_;
          uStack_450 = uStack_e10;
          uStack_e08 = auVar38._24_8_;
          uStack_448 = uStack_e08;
          local_5a0 = 0x3f8000003f800000;
          uStack_598 = 0x3f8000003f800000;
          uStack_590 = 0x3f8000003f800000;
          uStack_588 = 0x3f8000003f800000;
          local_5c0 = local_e40._0_8_;
          uStack_5b8 = local_e40._8_8_;
          uStack_5b0 = local_e40._16_8_;
          uStack_5a8 = local_e40._24_8_;
          auVar43._8_8_ = 0x3f8000003f800000;
          auVar43._0_8_ = 0x3f8000003f800000;
          auVar43._16_8_ = 0x3f8000003f800000;
          auVar43._24_8_ = 0x3f8000003f800000;
          local_480 = vpand_avx2(auVar43,local_e40);
          auVar48._16_8_ = uStack_e10;
          auVar48._0_16_ = _local_e20;
          auVar48._24_8_ = uStack_e08;
          _local_e20 = vsubps_avx(auVar48,local_480);
          local_da0 = auVar7._0_8_;
          uVar22 = local_da0;
          uStack_d98 = auVar7._8_8_;
          uVar23 = uStack_d98;
          uStack_d90 = auVar7._16_8_;
          uVar24 = uStack_d90;
          uStack_d88 = auVar7._24_8_;
          uVar25 = uStack_d88;
          local_e60 = auVar9._0_8_;
          uVar26 = local_e60;
          uStack_e58 = auVar9._8_8_;
          uVar27 = uStack_e58;
          uStack_e50 = auVar9._16_8_;
          uVar28 = uStack_e50;
          uStack_e48 = auVar9._24_8_;
          uVar29 = uStack_e48;
          local_720._0_4_ = auVar7._0_4_;
          local_720._4_4_ = auVar7._4_4_;
          uStack_718._0_4_ = auVar7._8_4_;
          uStack_718._4_4_ = auVar7._12_4_;
          uStack_710._0_4_ = auVar7._16_4_;
          uStack_710._4_4_ = auVar7._20_4_;
          uStack_708._0_4_ = auVar7._24_4_;
          uStack_708._4_4_ = auVar7._28_4_;
          local_740._0_4_ = auVar9._0_4_;
          local_740._4_4_ = auVar9._4_4_;
          uStack_738._0_4_ = auVar9._8_4_;
          uStack_738._4_4_ = auVar9._12_4_;
          uStack_730._0_4_ = auVar9._16_4_;
          uStack_730._4_4_ = auVar9._20_4_;
          uStack_728._0_4_ = auVar9._24_4_;
          uStack_728._4_4_ = auVar9._28_4_;
          local_720._0_4_ = (float)local_720 + (float)local_740;
          local_720._4_4_ = local_720._4_4_ + local_740._4_4_;
          uStack_718._0_4_ = (float)uStack_718 + (float)uStack_738;
          uStack_718._4_4_ = uStack_718._4_4_ + uStack_738._4_4_;
          uStack_710._0_4_ = (float)uStack_710 + (float)uStack_730;
          uStack_710._4_4_ = uStack_710._4_4_ + uStack_730._4_4_;
          uStack_708._0_4_ = (float)uStack_708 + (float)uStack_728;
          fStack_e64 = uStack_708._4_4_ + uStack_728._4_4_;
          local_da0._4_4_ = local_720._4_4_;
          local_da0._0_4_ = (float)local_720;
          uStack_d98._0_4_ = (float)uStack_718;
          uStack_d98._4_4_ = uStack_718._4_4_;
          uStack_d90._0_4_ = (float)uStack_710;
          uStack_d90._4_4_ = uStack_710._4_4_;
          auVar57 = _local_da0;
          uStack_d88._0_4_ = (float)uStack_708;
          uStack_d88._4_4_ = fStack_e64;
          auVar7 = _local_da0;
          local_a40 = local_da0;
          uStack_a38 = uStack_d98;
          uStack_d90 = auVar57._16_8_;
          uStack_a30 = uStack_d90;
          uStack_d88 = auVar7._24_8_;
          uStack_a28 = uStack_d88;
          local_e80 = (float)local_720 * (float)local_720;
          fStack_e7c = local_720._4_4_ * local_720._4_4_;
          fStack_e78 = (float)uStack_718 * (float)uStack_718;
          fStack_e74 = uStack_718._4_4_ * uStack_718._4_4_;
          fStack_e70 = (float)uStack_710 * (float)uStack_710;
          fStack_e6c = uStack_710._4_4_ * uStack_710._4_4_;
          fStack_e68 = (float)uStack_708 * (float)uStack_708;
          uStack_e98._0_4_ = 0x3d9021bb;
          local_ea0 = (undefined1  [8])0x3d9021bb3d9021bb;
          uStack_e98._4_4_ = 0x3d9021bb;
          uStack_e90._0_4_ = 0x3d9021bb;
          uStack_e90._4_4_ = 0x3d9021bb;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = 0x3d9021bb;
          uStack_e88._4_4_ = 0x3d9021bb;
          auVar7 = _local_ea0;
          local_a60 = 0x3d9021bb3d9021bb;
          uStack_a58 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_a50 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_a48 = uStack_e88;
          local_a80 = local_da0;
          uStack_a78 = uStack_d98;
          uStack_a70 = uStack_d90;
          uStack_a68 = uStack_d88;
          local_ea0._4_4_ = local_720._4_4_ * 0.070376836;
          local_ea0._0_4_ = (float)local_720 * 0.070376836;
          uStack_e98._0_4_ = (float)uStack_718 * 0.070376836;
          uStack_e98._4_4_ = uStack_718._4_4_ * 0.070376836;
          uStack_e90._0_4_ = (float)uStack_710 * 0.070376836;
          uStack_e90._4_4_ = uStack_710._4_4_ * 0.070376836;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = (float)uStack_708 * 0.070376836;
          uStack_e88._4_4_ = 0x3d9021bb;
          auVar7 = _local_ea0;
          local_760 = local_ea0;
          uStack_758 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_750 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_748 = uStack_e88;
          local_780 = 0xbdebd1b8;
          uStack_77c = 0xbdebd1b8;
          uStack_778 = 0xbdebd1b8;
          uStack_774 = 0xbdebd1b8;
          uStack_770 = 0xbdebd1b8;
          uStack_76c = 0xbdebd1b8;
          uStack_768 = 0xbdebd1b8;
          uStack_764 = 0xbdebd1b8;
          local_ea0._0_4_ = (float)local_720 * 0.070376836 + -0.1151461;
          local_ea0._4_4_ = local_720._4_4_ * 0.070376836 + -0.1151461;
          fVar66 = (float)uStack_718 * 0.070376836 + -0.1151461;
          fVar67 = uStack_718._4_4_ * 0.070376836 + -0.1151461;
          fVar68 = (float)uStack_710 * 0.070376836 + -0.1151461;
          fVar69 = uStack_710._4_4_ * 0.070376836 + -0.1151461;
          fVar70 = (float)uStack_708 * 0.070376836 + -0.1151461;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0xbd375ffa;
          auVar7 = _local_ea0;
          local_aa0 = local_ea0;
          uStack_a98 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_a90 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_a88 = uStack_e88;
          local_ac0 = local_da0;
          uStack_ab8 = uStack_d98;
          uStack_ab0 = uStack_d90;
          uStack_aa8 = uStack_d88;
          local_ea0._0_4_ = (float)local_ea0._0_4_ * (float)local_720;
          local_ea0._4_4_ = (float)local_ea0._4_4_ * local_720._4_4_;
          fVar66 = fVar66 * (float)uStack_718;
          fVar67 = fVar67 * uStack_718._4_4_;
          fVar68 = fVar68 * (float)uStack_710;
          fVar69 = fVar69 * uStack_710._4_4_;
          fVar70 = fVar70 * (float)uStack_708;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0xbd375ffa;
          auVar7 = _local_ea0;
          local_7a0 = local_ea0;
          uStack_798 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_790 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_788 = uStack_e88;
          local_7c0 = 0x3def251a;
          uStack_7bc = 0x3def251a;
          uStack_7b8 = 0x3def251a;
          uStack_7b4 = 0x3def251a;
          uStack_7b0 = 0x3def251a;
          uStack_7ac = 0x3def251a;
          uStack_7a8 = 0x3def251a;
          uStack_7a4 = 0x3def251a;
          local_ea0._0_4_ = (float)local_ea0._0_4_ + 0.116769984;
          local_ea0._4_4_ = (float)local_ea0._4_4_ + 0.116769984;
          fVar66 = fVar66 + 0.116769984;
          fVar67 = fVar67 + 0.116769984;
          fVar68 = fVar68 + 0.116769984;
          fVar69 = fVar69 + 0.116769984;
          fVar70 = fVar70 + 0.116769984;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0x3d93751d;
          auVar7 = _local_ea0;
          local_ae0 = local_ea0;
          uStack_ad8 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_ad0 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_ac8 = uStack_e88;
          local_b00 = local_da0;
          uStack_af8 = uStack_d98;
          uStack_af0 = uStack_d90;
          uStack_ae8 = uStack_d88;
          local_ea0._0_4_ = (float)local_ea0._0_4_ * (float)local_720;
          local_ea0._4_4_ = (float)local_ea0._4_4_ * local_720._4_4_;
          fVar66 = fVar66 * (float)uStack_718;
          fVar67 = fVar67 * uStack_718._4_4_;
          fVar68 = fVar68 * (float)uStack_710;
          fVar69 = fVar69 * uStack_710._4_4_;
          fVar70 = fVar70 * (float)uStack_708;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0x3d93751d;
          auVar7 = _local_ea0;
          local_7e0 = local_ea0;
          uStack_7d8 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_7d0 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_7c8 = uStack_e88;
          local_800 = 0xbdfe5d4f;
          uStack_7fc = 0xbdfe5d4f;
          uStack_7f8 = 0xbdfe5d4f;
          uStack_7f4 = 0xbdfe5d4f;
          uStack_7f0 = 0xbdfe5d4f;
          uStack_7ec = 0xbdfe5d4f;
          uStack_7e8 = 0xbdfe5d4f;
          uStack_7e4 = 0xbdfe5d4f;
          local_ea0._0_4_ = (float)local_ea0._0_4_ + -0.12420141;
          local_ea0._4_4_ = (float)local_ea0._4_4_ + -0.12420141;
          fVar66 = fVar66 + -0.12420141;
          fVar67 = fVar67 + -0.12420141;
          fVar68 = fVar68 + -0.12420141;
          fVar69 = fVar69 + -0.12420141;
          fVar70 = fVar70 + -0.12420141;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0xbd55d064;
          auVar7 = _local_ea0;
          local_b20 = local_ea0;
          uStack_b18 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_b10 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_b08 = uStack_e88;
          local_b40 = local_da0;
          uStack_b38 = uStack_d98;
          uStack_b30 = uStack_d90;
          uStack_b28 = uStack_d88;
          local_ea0._0_4_ = (float)local_ea0._0_4_ * (float)local_720;
          local_ea0._4_4_ = (float)local_ea0._4_4_ * local_720._4_4_;
          fVar66 = fVar66 * (float)uStack_718;
          fVar67 = fVar67 * uStack_718._4_4_;
          fVar68 = fVar68 * (float)uStack_710;
          fVar69 = fVar69 * uStack_710._4_4_;
          fVar70 = fVar70 * (float)uStack_708;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0xbd55d064;
          auVar7 = _local_ea0;
          local_820 = local_ea0;
          uStack_818 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_810 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_808 = uStack_e88;
          local_840 = 0x3e11e9bf;
          uStack_83c = 0x3e11e9bf;
          uStack_838 = 0x3e11e9bf;
          uStack_834 = 0x3e11e9bf;
          uStack_830 = 0x3e11e9bf;
          uStack_82c = 0x3e11e9bf;
          uStack_828 = 0x3e11e9bf;
          uStack_824 = 0x3e11e9bf;
          local_ea0._0_4_ = (float)local_ea0._0_4_ + 0.14249323;
          local_ea0._4_4_ = (float)local_ea0._4_4_ + 0.14249323;
          fVar66 = fVar66 + 0.14249323;
          fVar67 = fVar67 + 0.14249323;
          fVar68 = fVar68 + 0.14249323;
          fVar69 = fVar69 + 0.14249323;
          fVar70 = fVar70 + 0.14249323;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0x3db8eb4c;
          auVar7 = _local_ea0;
          local_b60 = local_ea0;
          uStack_b58 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_b50 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_b48 = uStack_e88;
          local_b80 = local_da0;
          uStack_b78 = uStack_d98;
          uStack_b70 = uStack_d90;
          uStack_b68 = uStack_d88;
          local_ea0._0_4_ = (float)local_ea0._0_4_ * (float)local_720;
          local_ea0._4_4_ = (float)local_ea0._4_4_ * local_720._4_4_;
          fVar66 = fVar66 * (float)uStack_718;
          fVar67 = fVar67 * uStack_718._4_4_;
          fVar68 = fVar68 * (float)uStack_710;
          fVar69 = fVar69 * uStack_710._4_4_;
          fVar70 = fVar70 * (float)uStack_708;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0x3db8eb4c;
          auVar7 = _local_ea0;
          local_860 = local_ea0;
          uStack_858 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_850 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_848 = uStack_e88;
          local_880 = 0xbe2aae50;
          uStack_87c = 0xbe2aae50;
          uStack_878 = 0xbe2aae50;
          uStack_874 = 0xbe2aae50;
          uStack_870 = 0xbe2aae50;
          uStack_86c = 0xbe2aae50;
          uStack_868 = 0xbe2aae50;
          uStack_864 = 0xbe2aae50;
          local_ea0._0_4_ = (float)local_ea0._0_4_ + -0.16668057;
          local_ea0._4_4_ = (float)local_ea0._4_4_ + -0.16668057;
          fVar66 = fVar66 + -0.16668057;
          fVar67 = fVar67 + -0.16668057;
          fVar68 = fVar68 + -0.16668057;
          fVar69 = fVar69 + -0.16668057;
          fVar70 = fVar70 + -0.16668057;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0xbd9c7154;
          auVar7 = _local_ea0;
          local_ba0 = local_ea0;
          uStack_b98 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_b90 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_b88 = uStack_e88;
          local_bc0 = local_da0;
          uStack_bb8 = uStack_d98;
          uStack_bb0 = uStack_d90;
          uStack_ba8 = uStack_d88;
          local_ea0._0_4_ = (float)local_ea0._0_4_ * (float)local_720;
          local_ea0._4_4_ = (float)local_ea0._4_4_ * local_720._4_4_;
          fVar66 = fVar66 * (float)uStack_718;
          fVar67 = fVar67 * uStack_718._4_4_;
          fVar68 = fVar68 * (float)uStack_710;
          fVar69 = fVar69 * uStack_710._4_4_;
          fVar70 = fVar70 * (float)uStack_708;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0xbd9c7154;
          auVar7 = _local_ea0;
          local_8a0 = local_ea0;
          uStack_898 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_890 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_888 = uStack_e88;
          local_8c0 = 0x3e4cceac;
          uStack_8bc = 0x3e4cceac;
          uStack_8b8 = 0x3e4cceac;
          uStack_8b4 = 0x3e4cceac;
          uStack_8b0 = 0x3e4cceac;
          uStack_8ac = 0x3e4cceac;
          uStack_8a8 = 0x3e4cceac;
          uStack_8a4 = 0x3e4cceac;
          local_ea0._0_4_ = (float)local_ea0._0_4_ + 0.20000714;
          local_ea0._4_4_ = (float)local_ea0._4_4_ + 0.20000714;
          fVar66 = fVar66 + 0.20000714;
          fVar67 = fVar67 + 0.20000714;
          fVar68 = fVar68 + 0.20000714;
          fVar69 = fVar69 + 0.20000714;
          fVar70 = fVar70 + 0.20000714;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0x3dfd2c04;
          auVar7 = _local_ea0;
          local_be0 = local_ea0;
          uStack_bd8 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_bd0 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_bc8 = uStack_e88;
          local_c00 = local_da0;
          uStack_bf8 = uStack_d98;
          uStack_bf0 = uStack_d90;
          uStack_be8 = uStack_d88;
          local_ea0._0_4_ = (float)local_ea0._0_4_ * (float)local_720;
          local_ea0._4_4_ = (float)local_ea0._4_4_ * local_720._4_4_;
          fVar66 = fVar66 * (float)uStack_718;
          fVar67 = fVar67 * uStack_718._4_4_;
          fVar68 = fVar68 * (float)uStack_710;
          fVar69 = fVar69 * uStack_710._4_4_;
          fVar70 = fVar70 * (float)uStack_708;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0x3dfd2c04;
          auVar7 = _local_ea0;
          local_8e0 = local_ea0;
          uStack_8d8 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_8d0 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_8c8 = uStack_e88;
          local_900 = 0xbe7ffffc;
          uStack_8fc = 0xbe7ffffc;
          uStack_8f8 = 0xbe7ffffc;
          uStack_8f4 = 0xbe7ffffc;
          uStack_8f0 = 0xbe7ffffc;
          uStack_8ec = 0xbe7ffffc;
          uStack_8e8 = 0xbe7ffffc;
          uStack_8e4 = 0xbe7ffffc;
          local_ea0._0_4_ = (float)local_ea0._0_4_ + -0.24999994;
          local_ea0._4_4_ = (float)local_ea0._4_4_ + -0.24999994;
          fVar66 = fVar66 + -0.24999994;
          fVar67 = fVar67 + -0.24999994;
          fVar68 = fVar68 + -0.24999994;
          fVar69 = fVar69 + -0.24999994;
          fVar70 = fVar70 + -0.24999994;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0xbe0169fa;
          auVar7 = _local_ea0;
          local_c20 = local_ea0;
          uStack_c18 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_c10 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_c08 = uStack_e88;
          local_c40 = local_da0;
          uStack_c38 = uStack_d98;
          uStack_c30 = uStack_d90;
          uStack_c28 = uStack_d88;
          local_ea0._0_4_ = (float)local_ea0._0_4_ * (float)local_720;
          local_ea0._4_4_ = (float)local_ea0._4_4_ * local_720._4_4_;
          fVar66 = fVar66 * (float)uStack_718;
          fVar67 = fVar67 * uStack_718._4_4_;
          fVar68 = fVar68 * (float)uStack_710;
          fVar69 = fVar69 * uStack_710._4_4_;
          fVar70 = fVar70 * (float)uStack_708;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0xbe0169fa;
          auVar7 = _local_ea0;
          local_920 = local_ea0;
          uStack_918 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_910 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_908 = uStack_e88;
          local_940 = 0x3eaaaaaa;
          uStack_93c = 0x3eaaaaaa;
          uStack_938 = 0x3eaaaaaa;
          uStack_934 = 0x3eaaaaaa;
          uStack_930 = 0x3eaaaaaa;
          uStack_92c = 0x3eaaaaaa;
          uStack_928 = 0x3eaaaaaa;
          uStack_924 = 0x3eaaaaaa;
          local_ea0._0_4_ = (float)local_ea0._0_4_ + 0.3333333;
          local_ea0._4_4_ = (float)local_ea0._4_4_ + 0.3333333;
          fVar66 = fVar66 + 0.3333333;
          fVar67 = fVar67 + 0.3333333;
          fVar68 = fVar68 + 0.3333333;
          fVar69 = fVar69 + 0.3333333;
          fVar70 = fVar70 + 0.3333333;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0x3e53eb5a;
          auVar7 = _local_ea0;
          local_c60 = local_ea0;
          uStack_c58 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_c50 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_c48 = uStack_e88;
          local_c80 = local_da0;
          uStack_c78 = uStack_d98;
          uStack_c70 = uStack_d90;
          uStack_c68 = uStack_d88;
          local_ea0._0_4_ = (float)local_ea0._0_4_ * (float)local_720;
          local_ea0._4_4_ = (float)local_ea0._4_4_ * local_720._4_4_;
          fVar66 = fVar66 * (float)uStack_718;
          fVar67 = fVar67 * uStack_718._4_4_;
          fVar68 = fVar68 * (float)uStack_710;
          fVar69 = fVar69 * uStack_710._4_4_;
          fVar70 = fVar70 * (float)uStack_708;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0x3e53eb5a;
          auVar7 = _local_ea0;
          local_ca0 = local_ea0;
          uStack_c98 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_c90 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_c88 = uStack_e88;
          local_cc0 = CONCAT44(fStack_e7c,local_e80);
          uStack_cb8 = CONCAT44(fStack_e74,fStack_e78);
          uStack_cb0 = CONCAT44(fStack_e6c,fStack_e70);
          uStack_ca8 = CONCAT44(fStack_e64,fStack_e68);
          local_ea0._0_4_ = (float)local_ea0._0_4_ * local_e80;
          local_ea0._4_4_ = (float)local_ea0._4_4_ * fStack_e7c;
          fVar66 = fVar66 * fStack_e78;
          fVar67 = fVar67 * fStack_e74;
          fVar68 = fVar68 * fStack_e70;
          fVar69 = fVar69 * fStack_e6c;
          fVar70 = fVar70 * fStack_e68;
          uStack_e98._0_4_ = fVar66;
          uStack_e98._4_4_ = fVar67;
          uStack_e90._0_4_ = fVar68;
          uStack_e90._4_4_ = fVar69;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70;
          uStack_e88._4_4_ = 0x3e53eb5a;
          auVar7 = _local_ea0;
          local_d00 = 0xb95e8083;
          uStack_cfc = 0xb95e8083;
          uStack_cf8 = 0xb95e8083;
          uStack_cf4 = 0xb95e8083;
          uStack_cf0 = 0xb95e8083;
          uStack_cec = 0xb95e8083;
          uStack_ce8 = 0xb95e8083;
          uStack_ce4 = 0xb95e8083;
          local_ce0._0_4_ = local_e20._0_4_;
          local_ce0._4_4_ = local_e20._4_4_;
          uStack_cd8._0_4_ = local_e20._8_4_;
          uStack_cd8._4_4_ = local_e20._12_4_;
          uStack_cd0._0_4_ = local_e20._16_4_;
          uStack_cd0._4_4_ = local_e20._20_4_;
          uStack_cc8._0_4_ = local_e20._24_4_;
          uStack_cc8._4_4_ = local_e20._28_4_;
          local_e60._4_4_ = local_ce0._4_4_ * -0.00021219444;
          local_e60._0_4_ = (float)local_ce0 * -0.00021219444;
          uStack_e58._0_4_ = (float)uStack_cd8 * -0.00021219444;
          uStack_e58._4_4_ = uStack_cd8._4_4_ * -0.00021219444;
          uStack_e50._0_4_ = (float)uStack_cd0 * -0.00021219444;
          uStack_e50._4_4_ = uStack_cd0._4_4_ * -0.00021219444;
          auVar58 = _local_e60;
          uStack_e48._0_4_ = (float)uStack_cc8 * -0.00021219444;
          uStack_e48._4_4_ = uStack_cc8._4_4_;
          auVar9 = _local_e60;
          local_960 = local_ea0;
          uStack_958 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_950 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_948 = uStack_e88;
          local_980 = local_e60;
          uStack_978 = uStack_e58;
          uStack_e50 = auVar58._16_8_;
          uStack_970 = uStack_e50;
          uStack_e48 = auVar9._24_8_;
          uStack_968 = uStack_e48;
          local_ea0._4_4_ = (float)local_ea0._4_4_ + local_ce0._4_4_ * -0.00021219444;
          local_ea0._0_4_ = (float)local_ea0._0_4_ + (float)local_ce0 * -0.00021219444;
          uStack_e98._0_4_ = fVar66 + (float)uStack_cd8 * -0.00021219444;
          uStack_e98._4_4_ = fVar67 + uStack_cd8._4_4_ * -0.00021219444;
          uStack_e90._0_4_ = fVar68 + (float)uStack_cd0 * -0.00021219444;
          uStack_e90._4_4_ = fVar69 + uStack_cd0._4_4_ * -0.00021219444;
          auVar57 = _local_ea0;
          uStack_e88._0_4_ = fVar70 + (float)uStack_cc8 * -0.00021219444;
          uStack_e88._4_4_ = uStack_cc8._4_4_ + 0.20695248;
          auVar7 = _local_ea0;
          local_d20 = CONCAT44(fStack_e7c,local_e80);
          uStack_d18 = CONCAT44(fStack_e74,fStack_e78);
          uStack_d10 = CONCAT44(fStack_e6c,fStack_e70);
          uStack_d08 = CONCAT44(fStack_e64,fStack_e68);
          local_d40 = 0x3f000000;
          uStack_d3c = 0x3f000000;
          uStack_d38 = 0x3f000000;
          uStack_d34 = 0x3f000000;
          uStack_d30 = 0x3f000000;
          uStack_d2c = 0x3f000000;
          uStack_d28 = 0x3f000000;
          uStack_d24 = 0x3f000000;
          local_e60._4_4_ = fStack_e7c * 0.5;
          local_e60._0_4_ = local_e80 * 0.5;
          uStack_e58._0_4_ = fStack_e78 * 0.5;
          uStack_e58._4_4_ = fStack_e74 * 0.5;
          uStack_e50._0_4_ = fStack_e70 * 0.5;
          uStack_e50._4_4_ = fStack_e6c * 0.5;
          auVar58 = _local_e60;
          uStack_e48._0_4_ = fStack_e68 * 0.5;
          uStack_e48._4_4_ = fStack_e64;
          auVar9 = _local_e60;
          local_4a0 = local_ea0;
          uStack_498 = uStack_e98;
          uStack_e90 = auVar57._16_8_;
          uStack_490 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uStack_488 = uStack_e88;
          local_4c0 = local_e60;
          uStack_4b8 = uStack_e58;
          uStack_e50 = auVar58._16_8_;
          uStack_4b0 = uStack_e50;
          uStack_e48 = auVar9._24_8_;
          uStack_4a8 = uStack_e48;
          auVar47._16_8_ = uStack_e90;
          auVar47._0_16_ = _local_ea0;
          auVar47._24_8_ = uStack_e88;
          auVar46._16_8_ = uStack_e50;
          auVar46._0_16_ = _local_e60;
          auVar46._24_8_ = uStack_e48;
          auVar7 = vsubps_avx(auVar47,auVar46);
          local_d60 = local_e20;
          uStack_d58 = uStack_e18;
          uStack_d50 = uStack_e10;
          uStack_d48 = uStack_e08;
          local_d80 = 0x3f318000;
          uStack_d7c = 0x3f318000;
          uStack_d78 = 0x3f318000;
          uStack_d74 = 0x3f318000;
          uStack_d70 = 0x3f318000;
          uStack_d6c = 0x3f318000;
          uStack_d68 = 0x3f318000;
          uStack_d64 = 0x3f318000;
          local_e60._4_4_ = local_ce0._4_4_ * 0.6933594;
          local_e60._0_4_ = (float)local_ce0 * 0.6933594;
          uStack_e58._0_4_ = (float)uStack_cd8 * 0.6933594;
          uStack_e58._4_4_ = uStack_cd8._4_4_ * 0.6933594;
          uStack_e50._0_4_ = (float)uStack_cd0 * 0.6933594;
          uStack_e50._4_4_ = uStack_cd0._4_4_ * 0.6933594;
          auVar57 = _local_e60;
          uStack_e48._0_4_ = (float)uStack_cc8 * 0.6933594;
          uStack_e48._4_4_ = uStack_cc8._4_4_;
          auVar40 = _local_e60;
          local_9a0 = local_da0;
          uStack_998 = uStack_d98;
          uStack_990 = uStack_d90;
          uStack_988 = uStack_d88;
          local_ea0 = auVar7._0_8_;
          uVar30 = local_ea0;
          uStack_e98 = auVar7._8_8_;
          uVar31 = uStack_e98;
          uStack_e90 = auVar7._16_8_;
          uVar32 = uStack_e90;
          uStack_e88 = auVar7._24_8_;
          uVar33 = uStack_e88;
          local_9c0._0_4_ = auVar7._0_4_;
          local_9c0._4_4_ = auVar7._4_4_;
          uStack_9b8._0_4_ = auVar7._8_4_;
          uStack_9b8._4_4_ = auVar7._12_4_;
          uStack_9b0._0_4_ = auVar7._16_4_;
          uStack_9b0._4_4_ = auVar7._20_4_;
          uStack_9a8._0_4_ = auVar7._24_4_;
          uStack_9a8._4_4_ = auVar7._28_4_;
          local_da0._4_4_ = local_720._4_4_ + local_9c0._4_4_;
          local_da0._0_4_ = (float)local_720 + (float)local_9c0;
          uStack_d98._0_4_ = (float)uStack_718 + (float)uStack_9b8;
          uStack_d98._4_4_ = uStack_718._4_4_ + uStack_9b8._4_4_;
          uStack_d90._0_4_ = (float)uStack_710 + (float)uStack_9b0;
          uStack_d90._4_4_ = uStack_710._4_4_ + uStack_9b0._4_4_;
          auVar58 = _local_da0;
          uStack_d88._0_4_ = (float)uStack_708 + (float)uStack_9a8;
          uStack_d88._4_4_ = fStack_e64 + uStack_9a8._4_4_;
          auVar7 = _local_da0;
          local_9e0 = local_da0;
          uStack_9d8 = uStack_d98;
          uStack_d90 = auVar58._16_8_;
          uStack_9d0 = uStack_d90;
          uStack_d88 = auVar7._24_8_;
          uStack_9c8 = uStack_d88;
          local_a00 = local_e60;
          uStack_9f8 = uStack_e58;
          uStack_e50 = auVar57._16_8_;
          uStack_9f0 = uStack_e50;
          uStack_e48 = auVar40._24_8_;
          uStack_9e8 = uStack_e48;
          local_da0._4_4_ = local_720._4_4_ + local_9c0._4_4_ + local_ce0._4_4_ * 0.6933594;
          local_da0._0_4_ = (float)local_720 + (float)local_9c0 + (float)local_ce0 * 0.6933594;
          uStack_d98._0_4_ = (float)uStack_718 + (float)uStack_9b8 + (float)uStack_cd8 * 0.6933594;
          uStack_d98._4_4_ = uStack_718._4_4_ + uStack_9b8._4_4_ + uStack_cd8._4_4_ * 0.6933594;
          uStack_d90._0_4_ = (float)uStack_710 + (float)uStack_9b0 + (float)uStack_cd0 * 0.6933594;
          uStack_d90._4_4_ = uStack_710._4_4_ + uStack_9b0._4_4_ + uStack_cd0._4_4_ * 0.6933594;
          auVar57 = _local_da0;
          uStack_d88._0_4_ = (float)uStack_708 + (float)uStack_9a8 + (float)uStack_cc8 * 0.6933594;
          uStack_d88._4_4_ = fStack_e64 + uStack_9a8._4_4_ + uStack_cc8._4_4_;
          auVar41 = _local_da0;
          local_180 = local_da0;
          uStack_178 = uStack_d98;
          uStack_d90 = auVar57._16_8_;
          uStack_170 = uStack_d90;
          uStack_d88 = auVar41._24_8_;
          uStack_168 = uStack_d88;
          local_1a0 = local_e00._0_8_;
          uStack_198 = local_e00._8_8_;
          uStack_190 = local_e00._16_8_;
          uStack_188 = local_e00._24_8_;
          auVar54._16_8_ = uStack_d90;
          auVar54._0_16_ = _local_da0;
          auVar54._24_8_ = uStack_d88;
          _local_ea0 = vpor_avx2(auVar54,local_e00);
          local_1560._0_4_ = auVar6._0_4_;
          local_1560._4_4_ = auVar6._4_4_;
          uStack_1558._0_4_ = auVar6._8_4_;
          uStack_1558._4_4_ = auVar6._12_4_;
          uStack_1550._0_4_ = auVar5._0_4_;
          uStack_1550._4_4_ = auVar5._4_4_;
          uStack_1548._0_4_ = auVar5._8_4_;
          uStack_1548._4_4_ = auVar5._12_4_;
          local_1580._0_4_ = local_ea0._0_4_;
          local_1580._4_4_ = local_ea0._4_4_;
          uStack_1578._0_4_ = local_ea0._8_4_;
          uStack_1578._4_4_ = local_ea0._12_4_;
          uStack_1570._0_4_ = local_ea0._16_4_;
          uStack_1570._4_4_ = local_ea0._20_4_;
          uStack_1568._0_4_ = local_ea0._24_4_;
          local_1380._4_4_ = local_1560._4_4_ * local_1580._4_4_;
          local_1380._0_4_ = (float)local_1560 * (float)local_1580;
          uStack_1378._0_4_ = (float)uStack_1558 * (float)uStack_1578;
          uStack_1378._4_4_ = uStack_1558._4_4_ * uStack_1578._4_4_;
          uStack_1370._0_4_ = (float)uStack_1550 * (float)uStack_1570;
          uStack_1370._4_4_ = uStack_1550._4_4_ * uStack_1570._4_4_;
          auVar57 = _local_1380;
          uStack_1368._0_4_ = (float)uStack_1548 * (float)uStack_1568;
          uStack_1368._4_4_ = uStack_1548._4_4_;
          auVar7 = _local_1380;
          local_6a0 = ZEXT432(0) << 0x20;
          local_1400 = 0x3f800000;
          uStack_13fc = 0x3f800000;
          uStack_13f8 = 0x3f800000;
          uStack_13f4 = 0x3f800000;
          uStack_13f0 = 0x3f800000;
          uStack_13ec = 0x3f800000;
          uStack_13e8 = 0x3f800000;
          uStack_13e4 = 0x3f800000;
          local_660 = local_1380;
          uStack_658 = uStack_1378;
          uStack_1370 = auVar57._16_8_;
          uStack_650 = uStack_1370;
          uStack_1368 = auVar7._24_8_;
          uStack_648 = uStack_1368;
          local_680 = 0x42b0c0a5;
          uStack_67c = 0x42b0c0a5;
          uStack_678 = 0x42b0c0a5;
          uStack_674 = 0x42b0c0a5;
          uStack_670 = 0x42b0c0a5;
          uStack_66c = 0x42b0c0a5;
          uStack_668 = 0x42b0c0a5;
          uStack_664 = 0x42b0c0a5;
          auVar39._16_8_ = uStack_1370;
          auVar39._0_16_ = _local_1380;
          auVar39._24_8_ = uStack_1368;
          auVar38._8_4_ = 0x42b0c0a5;
          auVar38._0_8_ = 0x42b0c0a542b0c0a5;
          auVar38._12_4_ = 0x42b0c0a5;
          auVar38._16_4_ = 0x42b0c0a5;
          auVar38._20_4_ = 0x42b0c0a5;
          auVar38._24_4_ = 0x42b0c0a5;
          auVar38._28_4_ = 0x42b0c0a5;
          auVar7 = vminps_avx(auVar39,auVar38);
          local_1380 = auVar7._0_8_;
          local_5e0 = local_1380;
          uStack_1378 = auVar7._8_8_;
          uStack_5d8 = uStack_1378;
          uStack_1370 = auVar7._16_8_;
          uStack_5d0 = uStack_1370;
          uStack_1368 = auVar7._24_8_;
          uStack_5c8 = uStack_1368;
          local_600 = 0xc2b0c0a5;
          uStack_5fc = 0xc2b0c0a5;
          uStack_5f8 = 0xc2b0c0a5;
          uStack_5f4 = 0xc2b0c0a5;
          uStack_5f0 = 0xc2b0c0a5;
          uStack_5ec = 0xc2b0c0a5;
          uStack_5e8 = 0xc2b0c0a5;
          uStack_5e4 = 0xc2b0c0a5;
          auVar42._8_4_ = 0xc2b0c0a5;
          auVar42._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar42._12_4_ = 0xc2b0c0a5;
          auVar42._16_4_ = 0xc2b0c0a5;
          auVar42._20_4_ = 0xc2b0c0a5;
          auVar42._24_4_ = 0xc2b0c0a5;
          auVar42._28_4_ = 0xc2b0c0a5;
          auVar9 = vmaxps_avx(auVar7,auVar42);
          local_1380 = auVar9._0_8_;
          uVar34 = local_1380;
          uStack_1378 = auVar9._8_8_;
          uVar35 = uStack_1378;
          uStack_1370 = auVar9._16_8_;
          uVar36 = uStack_1370;
          uStack_1368 = auVar9._24_8_;
          uVar37 = uStack_1368;
          local_10e0 = 0x3fb8aa3b;
          uStack_10dc = 0x3fb8aa3b;
          uStack_10d8 = 0x3fb8aa3b;
          uStack_10d4 = 0x3fb8aa3b;
          uStack_10d0 = 0x3fb8aa3b;
          uStack_10cc = 0x3fb8aa3b;
          uStack_10c8 = 0x3fb8aa3b;
          uStack_10c4 = 0x3fb8aa3b;
          local_10c0._0_4_ = auVar9._0_4_;
          local_10c0._4_4_ = auVar9._4_4_;
          uStack_10b8._0_4_ = auVar9._8_4_;
          uStack_10b8._4_4_ = auVar9._12_4_;
          uStack_10b0._0_4_ = auVar9._16_4_;
          uStack_10b0._4_4_ = auVar9._20_4_;
          uStack_10a8._0_4_ = auVar9._24_4_;
          uStack_10a8._4_4_ = auVar9._28_4_;
          local_13c0._4_4_ = local_10c0._4_4_ * 1.442695;
          local_13c0._0_4_ = (float)local_10c0 * 1.442695;
          uStack_13b8._0_4_ = (float)uStack_10b8 * 1.442695;
          uStack_13b8._4_4_ = uStack_10b8._4_4_ * 1.442695;
          uStack_13b0._0_4_ = (float)uStack_10b0 * 1.442695;
          uStack_13b0._4_4_ = uStack_10b0._4_4_ * 1.442695;
          auVar57 = _local_13c0;
          uStack_13a8._0_4_ = (float)uStack_10a8 * 1.442695;
          uStack_13a8._4_4_ = uStack_10a8._4_4_;
          auVar7 = _local_13c0;
          local_ec0 = local_13c0;
          uStack_eb8 = uStack_13b8;
          uStack_13b0 = auVar57._16_8_;
          uStack_eb0 = uStack_13b0;
          uStack_13a8 = auVar7._24_8_;
          uStack_ea8 = uStack_13a8;
          local_ee0 = 0x3f000000;
          uStack_edc = 0x3f000000;
          uStack_ed8 = 0x3f000000;
          uStack_ed4 = 0x3f000000;
          uStack_ed0 = 0x3f000000;
          uStack_ecc = 0x3f000000;
          uStack_ec8 = 0x3f000000;
          uStack_ec4 = 0x3f000000;
          local_13c0._4_4_ = local_10c0._4_4_ * 1.442695 + 0.5;
          local_13c0._0_4_ = (float)local_10c0 * 1.442695 + 0.5;
          uStack_13b8._0_4_ = (float)uStack_10b8 * 1.442695 + 0.5;
          uStack_13b8._4_4_ = uStack_10b8._4_4_ * 1.442695 + 0.5;
          uStack_13b0._0_4_ = (float)uStack_10b0 * 1.442695 + 0.5;
          uStack_13b0._4_4_ = uStack_10b0._4_4_ * 1.442695 + 0.5;
          uStack_13a8._0_4_ = (float)uStack_10a8 * 1.442695 + 0.5;
          uStack_13a8._4_4_ = uStack_10a8._4_4_ + 0.5;
          auVar8 = vroundps_avx(_local_13c0,1);
          auVar7 = vcmpps_avx(_local_13c0,auVar8,1);
          local_1420._0_8_ = auVar7._0_8_;
          local_4e0 = local_1420._0_8_;
          local_1420._8_8_ = auVar7._8_8_;
          uStack_4d8 = local_1420._8_8_;
          local_1420._16_8_ = auVar7._16_8_;
          uStack_4d0 = local_1420._16_8_;
          local_1420._24_8_ = auVar7._24_8_;
          uStack_4c8 = local_1420._24_8_;
          local_500 = 0x3f8000003f800000;
          uStack_4f8 = 0x3f8000003f800000;
          uStack_4f0 = 0x3f8000003f800000;
          uStack_4e8 = 0x3f8000003f800000;
          auVar45._8_8_ = 0x3f8000003f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar45._16_8_ = 0x3f8000003f800000;
          auVar45._24_8_ = 0x3f8000003f800000;
          local_1420 = vpand_avx2(auVar7,auVar45);
          local_13a0 = auVar8._0_8_;
          local_360 = local_13a0;
          uStack_1398 = auVar8._8_8_;
          uStack_358 = uStack_1398;
          uStack_1390 = auVar8._16_8_;
          uStack_350 = uStack_1390;
          uStack_1388 = auVar8._24_8_;
          uStack_348 = uStack_1388;
          local_380 = local_1420._0_8_;
          uStack_378 = local_1420._8_8_;
          uStack_370 = local_1420._16_8_;
          uStack_368 = local_1420._24_8_;
          _local_13c0 = vsubps_avx(auVar8,local_1420);
          local_1120 = 0x3f318000;
          uStack_111c = 0x3f318000;
          uStack_1118 = 0x3f318000;
          uStack_1114 = 0x3f318000;
          uStack_1110 = 0x3f318000;
          uStack_110c = 0x3f318000;
          uStack_1108 = 0x3f318000;
          uStack_1104 = 0x3f318000;
          local_1100._0_4_ = local_13c0._0_4_;
          local_1100._4_4_ = local_13c0._4_4_;
          uStack_10f8._0_4_ = local_13c0._8_4_;
          uStack_10f8._4_4_ = local_13c0._12_4_;
          uStack_10f0._0_4_ = local_13c0._16_4_;
          uStack_10f0._4_4_ = local_13c0._20_4_;
          uStack_10e8._0_4_ = local_13c0._24_4_;
          uStack_10e8._4_4_ = local_13c0._28_4_;
          local_13a0._4_4_ = local_1100._4_4_ * 0.6933594;
          local_13a0._0_4_ = (float)local_1100 * 0.6933594;
          uStack_1398._0_4_ = (float)uStack_10f8 * 0.6933594;
          uStack_1398._4_4_ = uStack_10f8._4_4_ * 0.6933594;
          uStack_1390._0_4_ = (float)uStack_10f0 * 0.6933594;
          uStack_1390._4_4_ = uStack_10f0._4_4_ * 0.6933594;
          auVar57 = _local_13a0;
          uStack_1388._0_4_ = (float)uStack_10e8 * 0.6933594;
          uStack_1388._4_4_ = uStack_10e8._4_4_;
          auVar38 = _local_13a0;
          local_1140 = local_13c0;
          uStack_1138 = uStack_13b8;
          uStack_1130 = uStack_13b0;
          uStack_1128 = uStack_13a8;
          local_1160 = 0xb95e8083;
          uStack_115c = 0xb95e8083;
          uStack_1158 = 0xb95e8083;
          uStack_1154 = 0xb95e8083;
          uStack_1150 = 0xb95e8083;
          uStack_114c = 0xb95e8083;
          uStack_1148 = 0xb95e8083;
          uStack_1144 = 0xb95e8083;
          local_3a0 = local_1380;
          uStack_398 = uStack_1378;
          uStack_390 = uStack_1370;
          uStack_388 = uStack_1368;
          local_3c0 = local_13a0;
          uStack_3b8 = uStack_1398;
          uStack_1390 = auVar57._16_8_;
          uStack_3b0 = uStack_1390;
          uStack_1388 = auVar38._24_8_;
          uStack_3a8 = uStack_1388;
          auVar51._16_8_ = uStack_1390;
          auVar51._0_16_ = _local_13a0;
          auVar51._24_8_ = uStack_1388;
          auVar7 = vsubps_avx(auVar9,auVar51);
          local_1380 = auVar7._0_8_;
          local_3e0 = local_1380;
          uStack_1378 = auVar7._8_8_;
          uStack_3d8 = uStack_1378;
          uStack_1370 = auVar7._16_8_;
          uStack_3d0 = uStack_1370;
          uStack_1368 = auVar7._24_8_;
          uStack_3c8 = uStack_1368;
          local_400 = CONCAT44(local_1100._4_4_ * -0.00021219444,(float)local_1100 * -0.00021219444)
          ;
          uStack_3f8 = CONCAT44(uStack_10f8._4_4_ * -0.00021219444,
                                (float)uStack_10f8 * -0.00021219444);
          uStack_3f0 = CONCAT44(uStack_10f0._4_4_ * -0.00021219444,
                                (float)uStack_10f0 * -0.00021219444);
          uStack_3e8 = CONCAT44(uStack_10e8._4_4_,(float)uStack_10e8 * -0.00021219444);
          auVar50._8_8_ = uStack_3f8;
          auVar50._0_8_ = local_400;
          auVar50._16_8_ = uStack_3f0;
          auVar50._24_8_ = uStack_3e8;
          _local_1380 = vsubps_avx(auVar7,auVar50);
          local_11a0 = local_1380;
          uStack_1198 = uStack_1378;
          uStack_1190 = uStack_1370;
          uStack_1188 = uStack_1368;
          local_1180._0_4_ = local_1380._0_4_;
          local_1180._4_4_ = local_1380._4_4_;
          uStack_1178._0_4_ = local_1380._8_4_;
          uStack_1178._4_4_ = local_1380._12_4_;
          uStack_1170._0_4_ = local_1380._16_4_;
          uStack_1170._4_4_ = local_1380._20_4_;
          uStack_1168._0_4_ = local_1380._24_4_;
          uStack_1168._4_4_ = local_1380._28_4_;
          fStack_1424 = uStack_1168._4_4_;
          local_1440 = (float)local_1180 * (float)local_1180;
          fStack_143c = local_1180._4_4_ * local_1180._4_4_;
          fStack_1438 = (float)uStack_1178 * (float)uStack_1178;
          fStack_1434 = uStack_1178._4_4_ * uStack_1178._4_4_;
          fStack_1430 = (float)uStack_1170 * (float)uStack_1170;
          fStack_142c = uStack_1170._4_4_ * uStack_1170._4_4_;
          fStack_1428 = (float)uStack_1168 * (float)uStack_1168;
          local_11c0 = 0x3950696739506967;
          uStack_11b8 = 0x3950696739506967;
          uStack_11b0 = 0x3950696739506967;
          uStack_11a8 = 0x3950696739506967;
          local_11e0 = local_1380;
          uStack_11d8 = uStack_1378;
          uStack_11d0 = uStack_1370;
          uStack_11c8 = uStack_1368;
          local_f00 = CONCAT44(local_1180._4_4_ * 0.00019875691,(float)local_1180 * 0.00019875691);
          uStack_ef8 = CONCAT44(uStack_1178._4_4_ * 0.00019875691,(float)uStack_1178 * 0.00019875691
                               );
          uStack_ef0 = CONCAT44(uStack_1170._4_4_ * 0.00019875691,(float)uStack_1170 * 0.00019875691
                               );
          uStack_ee8 = CONCAT44(0x39506967,(float)uStack_1168 * 0.00019875691);
          local_f20 = 0x3ab743ce;
          uStack_f1c = 0x3ab743ce;
          uStack_f18 = 0x3ab743ce;
          uStack_f14 = 0x3ab743ce;
          uStack_f10 = 0x3ab743ce;
          uStack_f0c = 0x3ab743ce;
          uStack_f08 = 0x3ab743ce;
          uStack_f04 = 0x3ab743ce;
          local_1460 = (float)local_1180 * 0.00019875691 + 0.0013981999;
          fStack_145c = local_1180._4_4_ * 0.00019875691 + 0.0013981999;
          fStack_1458 = (float)uStack_1178 * 0.00019875691 + 0.0013981999;
          fStack_1454 = uStack_1178._4_4_ * 0.00019875691 + 0.0013981999;
          fStack_1450 = (float)uStack_1170 * 0.00019875691 + 0.0013981999;
          fStack_144c = uStack_1170._4_4_ * 0.00019875691 + 0.0013981999;
          fStack_1448 = (float)uStack_1168 * 0.00019875691 + 0.0013981999;
          local_1200 = CONCAT44(fStack_145c,local_1460);
          uStack_11f8 = CONCAT44(fStack_1454,fStack_1458);
          uStack_11f0 = CONCAT44(fStack_144c,fStack_1450);
          uStack_11e8 = CONCAT44(0x3ad150fb,fStack_1448);
          local_1220 = local_1380;
          uStack_1218 = uStack_1378;
          uStack_1210 = uStack_1370;
          uStack_1208 = uStack_1368;
          local_1460 = local_1460 * (float)local_1180;
          fStack_145c = fStack_145c * local_1180._4_4_;
          fStack_1458 = fStack_1458 * (float)uStack_1178;
          fStack_1454 = fStack_1454 * uStack_1178._4_4_;
          fStack_1450 = fStack_1450 * (float)uStack_1170;
          fStack_144c = fStack_144c * uStack_1170._4_4_;
          fStack_1448 = fStack_1448 * (float)uStack_1168;
          local_f40 = CONCAT44(fStack_145c,local_1460);
          uStack_f38 = CONCAT44(fStack_1454,fStack_1458);
          uStack_f30 = CONCAT44(fStack_144c,fStack_1450);
          uStack_f28 = CONCAT44(0x3ad150fb,fStack_1448);
          local_f60 = 0x3c088908;
          uStack_f5c = 0x3c088908;
          uStack_f58 = 0x3c088908;
          uStack_f54 = 0x3c088908;
          uStack_f50 = 0x3c088908;
          uStack_f4c = 0x3c088908;
          uStack_f48 = 0x3c088908;
          uStack_f44 = 0x3c088908;
          local_1460 = local_1460 + 0.008333452;
          fStack_145c = fStack_145c + 0.008333452;
          fStack_1458 = fStack_1458 + 0.008333452;
          fStack_1454 = fStack_1454 + 0.008333452;
          fStack_1450 = fStack_1450 + 0.008333452;
          fStack_144c = fStack_144c + 0.008333452;
          fStack_1448 = fStack_1448 + 0.008333452;
          local_1240 = CONCAT44(fStack_145c,local_1460);
          uStack_1238 = CONCAT44(fStack_1454,fStack_1458);
          uStack_1230 = CONCAT44(fStack_144c,fStack_1450);
          uStack_1228 = CONCAT44(0x3c22b327,fStack_1448);
          local_1260 = local_1380;
          uStack_1258 = uStack_1378;
          uStack_1250 = uStack_1370;
          uStack_1248 = uStack_1368;
          local_1460 = local_1460 * (float)local_1180;
          fStack_145c = fStack_145c * local_1180._4_4_;
          fStack_1458 = fStack_1458 * (float)uStack_1178;
          fStack_1454 = fStack_1454 * uStack_1178._4_4_;
          fStack_1450 = fStack_1450 * (float)uStack_1170;
          fStack_144c = fStack_144c * uStack_1170._4_4_;
          fStack_1448 = fStack_1448 * (float)uStack_1168;
          local_f80 = CONCAT44(fStack_145c,local_1460);
          uStack_f78 = CONCAT44(fStack_1454,fStack_1458);
          uStack_f70 = CONCAT44(fStack_144c,fStack_1450);
          uStack_f68 = CONCAT44(0x3c22b327,fStack_1448);
          local_fa0 = 0x3d2aa9c1;
          uStack_f9c = 0x3d2aa9c1;
          uStack_f98 = 0x3d2aa9c1;
          uStack_f94 = 0x3d2aa9c1;
          uStack_f90 = 0x3d2aa9c1;
          uStack_f8c = 0x3d2aa9c1;
          uStack_f88 = 0x3d2aa9c1;
          uStack_f84 = 0x3d2aa9c1;
          local_1460 = local_1460 + 0.041665796;
          fStack_145c = fStack_145c + 0.041665796;
          fStack_1458 = fStack_1458 + 0.041665796;
          fStack_1454 = fStack_1454 + 0.041665796;
          fStack_1450 = fStack_1450 + 0.041665796;
          fStack_144c = fStack_144c + 0.041665796;
          fStack_1448 = fStack_1448 + 0.041665796;
          local_1280 = CONCAT44(fStack_145c,local_1460);
          uStack_1278 = CONCAT44(fStack_1454,fStack_1458);
          uStack_1270 = CONCAT44(fStack_144c,fStack_1450);
          uStack_1268 = CONCAT44(0x3d53568b,fStack_1448);
          local_12a0 = local_1380;
          uStack_1298 = uStack_1378;
          uStack_1290 = uStack_1370;
          uStack_1288 = uStack_1368;
          local_1460 = local_1460 * (float)local_1180;
          fStack_145c = fStack_145c * local_1180._4_4_;
          fStack_1458 = fStack_1458 * (float)uStack_1178;
          fStack_1454 = fStack_1454 * uStack_1178._4_4_;
          fStack_1450 = fStack_1450 * (float)uStack_1170;
          fStack_144c = fStack_144c * uStack_1170._4_4_;
          fStack_1448 = fStack_1448 * (float)uStack_1168;
          local_fc0 = CONCAT44(fStack_145c,local_1460);
          uStack_fb8 = CONCAT44(fStack_1454,fStack_1458);
          uStack_fb0 = CONCAT44(fStack_144c,fStack_1450);
          uStack_fa8 = CONCAT44(0x3d53568b,fStack_1448);
          local_fe0 = 0x3e2aaaaa;
          uStack_fdc = 0x3e2aaaaa;
          uStack_fd8 = 0x3e2aaaaa;
          uStack_fd4 = 0x3e2aaaaa;
          uStack_fd0 = 0x3e2aaaaa;
          uStack_fcc = 0x3e2aaaaa;
          uStack_fc8 = 0x3e2aaaaa;
          uStack_fc4 = 0x3e2aaaaa;
          local_1460 = local_1460 + 0.16666666;
          fStack_145c = fStack_145c + 0.16666666;
          fStack_1458 = fStack_1458 + 0.16666666;
          fStack_1454 = fStack_1454 + 0.16666666;
          fStack_1450 = fStack_1450 + 0.16666666;
          fStack_144c = fStack_144c + 0.16666666;
          fStack_1448 = fStack_1448 + 0.16666666;
          local_12c0 = CONCAT44(fStack_145c,local_1460);
          uStack_12b8 = CONCAT44(fStack_1454,fStack_1458);
          uStack_12b0 = CONCAT44(fStack_144c,fStack_1450);
          uStack_12a8 = CONCAT44(0x3e5f804d,fStack_1448);
          local_12e0 = local_1380;
          uStack_12d8 = uStack_1378;
          uStack_12d0 = uStack_1370;
          uStack_12c8 = uStack_1368;
          local_1460 = local_1460 * (float)local_1180;
          fStack_145c = fStack_145c * local_1180._4_4_;
          fStack_1458 = fStack_1458 * (float)uStack_1178;
          fStack_1454 = fStack_1454 * uStack_1178._4_4_;
          fStack_1450 = fStack_1450 * (float)uStack_1170;
          fStack_144c = fStack_144c * uStack_1170._4_4_;
          fStack_1448 = fStack_1448 * (float)uStack_1168;
          local_1000 = CONCAT44(fStack_145c,local_1460);
          uStack_ff8 = CONCAT44(fStack_1454,fStack_1458);
          uStack_ff0 = CONCAT44(fStack_144c,fStack_1450);
          uStack_fe8 = CONCAT44(0x3e5f804d,fStack_1448);
          local_1020 = 0x3f000000;
          uStack_101c = 0x3f000000;
          uStack_1018 = 0x3f000000;
          uStack_1014 = 0x3f000000;
          uStack_1010 = 0x3f000000;
          uStack_100c = 0x3f000000;
          uStack_1008 = 0x3f000000;
          uStack_1004 = 0x3f000000;
          local_1460 = local_1460 + 0.5;
          fStack_145c = fStack_145c + 0.5;
          fStack_1458 = fStack_1458 + 0.5;
          fStack_1454 = fStack_1454 + 0.5;
          fStack_1450 = fStack_1450 + 0.5;
          fStack_144c = fStack_144c + 0.5;
          fStack_1448 = fStack_1448 + 0.5;
          local_1300 = CONCAT44(fStack_145c,local_1460);
          uStack_12f8 = CONCAT44(fStack_1454,fStack_1458);
          uStack_12f0 = CONCAT44(fStack_144c,fStack_1450);
          uStack_12e8 = CONCAT44(0x3f37e013,fStack_1448);
          local_1320 = CONCAT44(fStack_143c,local_1440);
          uStack_1318 = CONCAT44(fStack_1434,fStack_1438);
          uStack_1310 = CONCAT44(fStack_142c,fStack_1430);
          uStack_1308 = CONCAT44(uStack_1168._4_4_,fStack_1428);
          local_1460 = local_1460 * local_1440;
          fStack_145c = fStack_145c * fStack_143c;
          fStack_1458 = fStack_1458 * fStack_1438;
          fStack_1454 = fStack_1454 * fStack_1434;
          fStack_1450 = fStack_1450 * fStack_1430;
          fStack_144c = fStack_144c * fStack_142c;
          fStack_1448 = fStack_1448 * fStack_1428;
          local_1040 = CONCAT44(fStack_145c,local_1460);
          uStack_1038 = CONCAT44(fStack_1454,fStack_1458);
          uStack_1030 = CONCAT44(fStack_144c,fStack_1450);
          uStack_1028 = CONCAT44(0x3f37e013,fStack_1448);
          local_1060 = local_1380;
          uStack_1058 = uStack_1378;
          uStack_1050 = uStack_1370;
          uStack_1048 = uStack_1368;
          local_1460 = local_1460 + (float)local_1180;
          fStack_145c = fStack_145c + local_1180._4_4_;
          fStack_1458 = fStack_1458 + (float)uStack_1178;
          fStack_1454 = fStack_1454 + uStack_1178._4_4_;
          fStack_1450 = fStack_1450 + (float)uStack_1170;
          fStack_144c = fStack_144c + uStack_1170._4_4_;
          fStack_1448 = fStack_1448 + (float)uStack_1168;
          local_1080 = CONCAT44(fStack_145c,local_1460);
          uStack_1078 = CONCAT44(fStack_1454,fStack_1458);
          uStack_1070 = CONCAT44(fStack_144c,fStack_1450);
          uStack_1068 = CONCAT44(uStack_1168._4_4_ + 0.71826285,fStack_1448);
          local_10a0 = 0x3f8000003f800000;
          uStack_1098 = 0x3f8000003f800000;
          uStack_1090 = 0x3f8000003f800000;
          uStack_1088 = 0x3f8000003f800000;
          local_1460 = local_1460 + 1.0;
          fStack_145c = fStack_145c + 1.0;
          fStack_1458 = fStack_1458 + 1.0;
          fStack_1454 = fStack_1454 + 1.0;
          fStack_1450 = fStack_1450 + 1.0;
          fStack_144c = fStack_144c + 1.0;
          fStack_1448 = fStack_1448 + 1.0;
          fStack_1444 = uStack_1168._4_4_ + 0.71826285 + 1.0;
          local_340 = local_13c0;
          uStack_338 = uStack_13b8;
          uStack_330 = uStack_13b0;
          uStack_328 = uStack_13a8;
          local_13e0 = CONCAT44((int)local_1100._4_4_,(int)(float)local_1100);
          uStack_13d8 = CONCAT44((int)uStack_10f8._4_4_,(int)(float)uStack_10f8);
          uStack_13d0 = CONCAT44((int)uStack_10f0._4_4_,(int)(float)uStack_10f0);
          uStack_13c8 = CONCAT44((int)uStack_10e8._4_4_,(int)(float)uStack_10e8);
          local_300 = local_13e0;
          uStack_2f8 = uStack_13d8;
          uStack_2f0 = uStack_13d0;
          uStack_2e8 = uStack_13c8;
          local_320 = 0x7f0000007f;
          uStack_318 = 0x7f0000007f;
          uStack_310 = 0x7f0000007f;
          uStack_308 = 0x7f0000007f;
          local_260 = local_13e0;
          uStack_258 = uStack_13d8;
          uStack_250 = uStack_13d0;
          uStack_248 = uStack_13c8;
          local_280 = 0x7f0000007f;
          uStack_278 = 0x7f0000007f;
          uStack_270 = 0x7f0000007f;
          uStack_268 = 0x7f0000007f;
          auVar53._8_8_ = uStack_13d8;
          auVar53._0_8_ = local_13e0;
          auVar53._16_8_ = uStack_13d0;
          auVar53._24_8_ = uStack_13c8;
          auVar52._8_8_ = 0x7f0000007f;
          auVar52._0_8_ = 0x7f0000007f;
          auVar52._16_8_ = 0x7f0000007f;
          auVar52._24_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx2(auVar53,auVar52);
          local_20e0 = auVar7._0_8_;
          uStack_20d8 = auVar7._8_8_;
          uStack_20d0 = auVar7._16_8_;
          uStack_20c8 = auVar7._24_8_;
          local_2c0 = local_20e0;
          uStack_2b8 = uStack_20d8;
          uStack_2b0 = uStack_20d0;
          uStack_2a8 = uStack_20c8;
          local_2c4 = 0x17;
          local_220 = local_20e0;
          uStack_218 = uStack_20d8;
          uStack_210 = uStack_20d0;
          uStack_208 = uStack_20c8;
          local_224 = 0x17;
          auVar7 = vpslld_avx2(auVar7,ZEXT416(0x17));
          local_2100 = auVar7._0_8_;
          local_13e0 = local_2100;
          uStack_20f8 = auVar7._8_8_;
          uStack_13d8 = uStack_20f8;
          uStack_20f0 = auVar7._16_8_;
          uStack_13d0 = uStack_20f0;
          uStack_20e8 = auVar7._24_8_;
          uStack_13c8 = uStack_20e8;
          local_2a0 = local_2100;
          uStack_298 = uStack_20f8;
          uStack_290 = uStack_20f0;
          uStack_288 = uStack_20e8;
          local_1480 = local_2100;
          uStack_1478 = uStack_20f8;
          uStack_1470 = uStack_20f0;
          uStack_1468 = uStack_20e8;
          local_1340 = CONCAT44(fStack_145c,local_1460);
          uStack_1338 = CONCAT44(fStack_1454,fStack_1458);
          uStack_1330 = CONCAT44(fStack_144c,fStack_1450);
          uStack_1328 = CONCAT44(fStack_1444,fStack_1448);
          local_1360._0_4_ = auVar7._0_4_;
          local_1360._4_4_ = auVar7._4_4_;
          uStack_1358._0_4_ = auVar7._8_4_;
          uStack_1358._4_4_ = auVar7._12_4_;
          uStack_1350._0_4_ = auVar7._16_4_;
          uStack_1350._4_4_ = auVar7._20_4_;
          uStack_1348._0_4_ = auVar7._24_4_;
          local_1460 = local_1460 * (float)local_1360;
          fStack_145c = fStack_145c * local_1360._4_4_;
          fStack_1458 = fStack_1458 * (float)uStack_1358;
          fStack_1454 = fStack_1454 * uStack_1358._4_4_;
          fStack_1450 = fStack_1450 * (float)uStack_1350;
          fStack_144c = fStack_144c * uStack_1350._4_4_;
          fStack_1448 = fStack_1448 * (float)uStack_1348;
          local_1c40 = CONCAT44(fStack_145c,local_1460);
          uStack_1c38 = CONCAT44(fStack_1454,fStack_1458);
          uStack_1c30 = CONCAT44(fStack_144c,fStack_1450);
          uStack_1c28 = CONCAT44(fStack_1444,fStack_1448);
          local_17c0._0_4_ = (float)uVar10;
          local_17c0._4_4_ = (float)((ulong)uVar10 >> 0x20);
          uStack_17b8._0_4_ = (float)uVar11;
          uStack_17b8._4_4_ = (float)((ulong)uVar11 >> 0x20);
          uStack_17b0._0_4_ = (float)uVar12;
          uStack_17b0._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_17a8._0_4_ = (float)uVar13;
          uStack_17a8._4_4_ = (undefined4)((ulong)uVar13 >> 0x20);
          local_1c20 = CONCAT44(local_17c0._4_4_ * fStack_145c,(float)local_17c0 * local_1460);
          uStack_1c18 = CONCAT44(uStack_17b8._4_4_ * fStack_1454,(float)uStack_17b8 * fStack_1458);
          uStack_1c10 = CONCAT44(uStack_17b0._4_4_ * fStack_144c,(float)uStack_17b0 * fStack_1450);
          uStack_1c08 = CONCAT44(uStack_17a8._4_4_,(float)uStack_17a8 * fStack_1448);
          local_16e8 = local_1ae8;
          auVar8._8_8_ = uStack_1c18;
          auVar8._0_8_ = local_1c20;
          auVar8._16_8_ = uStack_1c10;
          auVar8._24_8_ = uStack_1c08;
          *local_1ae8 = auVar8;
          local_1b38 = local_1b38 + 8;
          local_1ae8 = local_1ae8 + 1;
          local_17e0 = local_1c40;
          uStack_17d8 = uStack_1c38;
          uStack_17d0 = uStack_1c30;
          uStack_17c8 = uStack_1c28;
          local_17c0 = uVar10;
          uStack_17b8 = uVar11;
          uStack_17b0 = uVar12;
          uStack_17a8 = uVar13;
          local_17a0 = local_1500._0_8_;
          uStack_1798 = local_1500._8_8_;
          uStack_1790 = local_1500._16_8_;
          uStack_1788 = local_1500._24_8_;
          local_1780 = uVar14;
          uStack_1778 = uVar15;
          uStack_1770 = uVar16;
          uStack_1768 = uVar17;
          local_1720 = local_1c20;
          uStack_1718 = uStack_1c18;
          uStack_1710 = uStack_1c10;
          uStack_1708 = uStack_1c08;
          local_1660 = local_1540._0_8_;
          uStack_1658 = local_1540._8_8_;
          uStack_1650 = local_1540._16_8_;
          uStack_1648 = local_1540._24_8_;
          local_1580 = local_ea0;
          uStack_1578 = uStack_e98;
          uStack_1570 = uStack_e90;
          uStack_1568 = uStack_e88;
          local_1560 = local_14c0._0_8_;
          uStack_1558 = local_14c0._8_8_;
          uStack_1550 = local_14c0._16_8_;
          uStack_1548 = local_14c0._24_8_;
          _local_13a0 = auVar38;
          local_1360 = local_2100;
          uStack_1358 = uStack_20f8;
          uStack_1350 = uStack_20f0;
          uStack_1348 = uStack_20e8;
          local_1180 = local_11a0;
          uStack_1178 = uStack_1198;
          uStack_1170 = uStack_1190;
          uStack_1168 = uStack_1188;
          local_1100 = local_13c0;
          uStack_10f8 = uStack_13b8;
          uStack_10f0 = uStack_13b0;
          uStack_10e8 = uStack_13a8;
          local_10c0 = uVar34;
          uStack_10b8 = uVar35;
          uStack_10b0 = uVar36;
          uStack_10a8 = uVar37;
          _local_e60 = auVar40;
          _local_da0 = auVar41;
          local_ce0 = local_e20;
          uStack_cd8 = uStack_e18;
          uStack_cd0 = uStack_e10;
          uStack_cc8 = uStack_e08;
          local_a20 = local_a40;
          uStack_a18 = uStack_a38;
          uStack_a10 = uStack_a30;
          uStack_a08 = uStack_a28;
          local_9c0 = uVar30;
          uStack_9b8 = uVar31;
          uStack_9b0 = uVar32;
          uStack_9a8 = uVar33;
          local_740 = uVar26;
          uStack_738 = uVar27;
          uStack_730 = uVar28;
          uStack_728 = uVar29;
          local_720 = uVar22;
          uStack_718 = uVar23;
          uStack_710 = uVar24;
          uStack_708 = uVar25;
          local_6e0 = uVar18;
          uStack_6d8 = uVar19;
          uStack_6d0 = uVar20;
          uStack_6c8 = uVar21;
          local_620 = local_15a0;
          uStack_618 = uStack_1598;
          uStack_610 = uStack_1590;
          uStack_608 = uStack_1588;
        }
        for (; local_14c0 = auVar65, local_1500 = auVar64, local_1540 = auVar63,
            local_1b84 < local_1844; local_1b84 = local_1b84 + 1) {
          fVar66 = *(float *)*local_1ae8;
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)*local_1b38),ZEXT416((uint)local_19ec),
                                   ZEXT416(*(uint *)((long)in_RDI +
                                                    *(long *)(*in_RDI + -0x18) + 0xe0)));
          dVar62 = std::pow(auVar1._0_8_,
                            (double)((ulong)*(uint *)((long)in_RDI +
                                                     *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                    0x8000000080000000));
          *(float *)*local_1ae8 = fVar66 * SUB84(dVar62,0);
          local_1b38 = local_1b38 + 1;
          local_1ae8 = (undefined1 (*) [32])(*local_1ae8 + 4);
          auVar63 = local_1540;
          auVar64 = local_1500;
          auVar65 = local_14c0;
        }
      }
      local_18a0 = 0;
    }
    ncnn::Mat::~Mat((Mat *)0x4b648c);
joined_r0x004b6b2b:
    if (local_18a0 != 0) goto LAB_004b6b65;
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
    local_1c44 = local_182c;
    local_1c48 = local_1830;
    ncnn::Mat::Mat(in_stack_ffffffffffffde68,
                   (Mat *)CONCAT44(in_stack_ffffffffffffde64,in_stack_ffffffffffffde60));
    local_1c94 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
    if (local_1c94 < 1) {
LAB_004b663e:
      local_1ce4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_1ce4 = local_1ce4 * local_1ce4;
      local_1ce8 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) / (float)local_1ce4;
      std::allocator<int>::allocator((allocator<int> *)0x4b66a3);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffde8c,in_stack_ffffffffffffde88),
                 CONCAT44(in_stack_ffffffffffffde84,in_stack_ffffffffffffde80),
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      std::allocator<int>::~allocator((allocator<int> *)0x4b66c9);
      local_1d10 = std::vector<int,_std::allocator<int>_>::operator[](&local_1d00,0);
      local_1d14 = 0;
      local_1d18 = 0;
      local_1d1c = local_182c - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      for (local_1d20 = 0; local_1d20 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_1d20 = local_1d20 + 1) {
        for (local_1d24 = 0; local_1d24 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)
            ; local_1d24 = local_1d24 + 1) {
          local_1d10[local_1d14] = local_1d18;
          local_1d14 = local_1d14 + 1;
          local_1d18 = local_1d18 + 1;
        }
        local_1d18 = local_1d1c + local_1d18;
      }
      for (local_1d28 = 0; local_1d28 < local_1834; local_1d28 = local_1d28 + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffde90,(int)in_stack_ffffffffffffde8c);
        pfVar60 = ncnn::Mat::operator_cast_to_float_(&local_1d78);
        ncnn::Mat::~Mat((Mat *)0x4b6872);
        local_1d30 = pfVar60;
        ncnn::Mat::channel(in_stack_ffffffffffffde90,(int)in_stack_ffffffffffffde8c);
        for (local_1dc4 = 0; local_1dc4 < local_1c48; local_1dc4 = local_1dc4 + 1) {
          for (local_1dc8 = 0; local_1dc8 < local_1c44; local_1dc8 = local_1dc8 + 1) {
            in_stack_ffffffffffffde90 = (Mat *)ncnn::Mat::row(&local_1dc0,local_1dc4);
            local_1dd4 = 0.0;
            for (local_1dd8 = 0; local_1dd8 < local_1ce4; local_1dd8 = local_1dd8 + 1) {
              local_1dd4 = *(float *)((long)&in_stack_ffffffffffffde90->data +
                                     (long)local_1d10[local_1dd8] * 4 + (long)local_1dc8 * 4) +
                           local_1dd4;
            }
            fVar66 = local_1d30[local_1dc8];
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_1dd4),ZEXT416((uint)local_1ce8),
                                     ZEXT416(*(uint *)((long)in_RDI +
                                                      *(long *)(*in_RDI + -0x18) + 0xe0)));
            dVar62 = std::pow(auVar1._0_8_,
                              (double)((ulong)*(uint *)((long)in_RDI +
                                                       *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                      0x8000000080000000));
            in_stack_ffffffffffffde8c = SUB84(dVar62,0);
            local_1d30[local_1dc8] = fVar66 * in_stack_ffffffffffffde8c;
          }
          local_1d30 = local_1d30 + local_1c44;
        }
        ncnn::Mat::~Mat((Mat *)0x4b6ae7);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      local_18a0 = 0;
    }
    else {
      local_1ce0.data = (void *)*local_1828;
      local_1ce0.elemsize = local_1828[2];
      local_1ce0._24_8_ = local_1828[3];
      local_1ce0.allocator = (Allocator *)local_1828[4];
      local_1ce0._40_8_ = local_1828[5];
      local_1ce0._48_8_ = local_1828[6];
      local_1ce0._56_8_ = local_1828[7];
      local_1ce0.refcount = (int *)local_1828[2];
      this_00 = &local_1ce0;
      copy_make_border((Mat *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
                       (Mat *)CONCAT17(in_stack_ffffffffffffdeb7,in_stack_ffffffffffffdeb0),
                       (int)((ulong)in_stack_ffffffffffffdea8 >> 0x20),
                       (int)in_stack_ffffffffffffdea8,
                       (int)((ulong)in_stack_ffffffffffffdea0 >> 0x20),
                       (int)in_stack_ffffffffffffdea0,in_stack_ffffffffffffdec8,fVar66,
                       (Option *)CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0));
      bVar59 = ncnn::Mat::empty(this_00);
      if (!bVar59) {
        local_182c = local_1c64;
        local_1830 = local_1c60;
        goto LAB_004b663e;
      }
      local_180c = -100;
      local_18a0 = 1;
    }
    ncnn::Mat::~Mat((Mat *)0x4b6b22);
    goto joined_r0x004b6b2b;
  }
  local_180c = 0;
  local_18a0 = 1;
LAB_004b6b65:
  ncnn::Mat::~Mat((Mat *)0x4b6b75);
  return local_180c;
}

Assistant:

int LRN_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}